

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx::CurveNvIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined4 uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  uint uVar67;
  uint uVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  uint uVar72;
  ulong uVar73;
  uint uVar74;
  undefined4 uVar75;
  ulong uVar76;
  bool bVar77;
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar100;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar80 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar104;
  float fVar129;
  float fVar130;
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar131;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar132;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar133;
  float fVar152;
  float fVar153;
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar154;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar140 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar155;
  float fVar175;
  float fVar176;
  vint4 ai_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar177;
  undefined1 auVar158 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar178;
  float fVar194;
  float fVar195;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar196;
  undefined1 auVar188 [28];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  vint4 bi;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [28];
  float fVar216;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar214;
  float fVar215;
  undefined1 auVar213 [64];
  float fVar217;
  float fVar218;
  float fVar226;
  float fVar229;
  vint4 ai_1;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar224 [28];
  undefined1 auVar225 [32];
  float fVar244;
  float fVar250;
  float fVar251;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar252;
  undefined1 auVar248 [32];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [64];
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar296 [16];
  float fVar299;
  float fVar300;
  undefined1 auVar297 [32];
  undefined1 auVar298 [64];
  float fVar301;
  float fVar313;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  undefined1 auVar306 [64];
  float fVar314;
  float fVar315;
  float fVar320;
  float fVar322;
  float fVar324;
  float fVar326;
  float fVar328;
  float fVar330;
  float fVar331;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar319;
  float fVar321;
  float fVar323;
  float fVar325;
  float fVar327;
  float fVar329;
  undefined1 auVar318 [64];
  float fVar332;
  float fVar337;
  float fVar338;
  undefined1 auVar333 [16];
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar334 [32];
  float fVar339;
  undefined1 auVar335 [32];
  undefined1 auVar343 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar348 [32];
  undefined1 auVar355 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b0c;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  RTCFilterFunctionNArguments local_a78;
  int local_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 auStack_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined8 local_950;
  float local_948;
  float local_944;
  undefined4 local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [16];
  Primitive *local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar336 [64];
  
  PVar4 = prim[1];
  uVar69 = (ulong)(byte)PVar4;
  fVar155 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar88 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  auVar245._0_4_ = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar245._4_4_ = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar245._8_4_ = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar245._12_4_ = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar134._0_4_ = fVar155 * auVar88._0_4_;
  auVar134._4_4_ = fVar155 * auVar88._4_4_;
  auVar134._8_4_ = fVar155 * auVar88._8_4_;
  auVar134._12_4_ = fVar155 * auVar88._12_4_;
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar162 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar162 = vcvtdq2ps_avx(auVar162);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xc + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xd + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x12 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x13 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x14 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar306 = ZEXT1664(auVar106);
  auVar85 = vshufps_avx(auVar245,auVar245,0);
  auVar105 = vshufps_avx(auVar245,auVar245,0x55);
  auVar135 = vshufps_avx(auVar245,auVar245,0xaa);
  fVar155 = auVar135._0_4_;
  fVar178 = auVar135._4_4_;
  fVar175 = auVar135._8_4_;
  fVar194 = auVar135._12_4_;
  fVar256 = auVar105._0_4_;
  fVar267 = auVar105._4_4_;
  fVar272 = auVar105._8_4_;
  fVar277 = auVar105._12_4_;
  fVar176 = auVar85._0_4_;
  fVar195 = auVar85._4_4_;
  fVar177 = auVar85._8_4_;
  fVar196 = auVar85._12_4_;
  auVar333._0_4_ = fVar176 * auVar88._0_4_ + fVar256 * auVar162._0_4_ + fVar155 * auVar8._0_4_;
  auVar333._4_4_ = fVar195 * auVar88._4_4_ + fVar267 * auVar162._4_4_ + fVar178 * auVar8._4_4_;
  auVar333._8_4_ = fVar177 * auVar88._8_4_ + fVar272 * auVar162._8_4_ + fVar175 * auVar8._8_4_;
  auVar333._12_4_ = fVar196 * auVar88._12_4_ + fVar277 * auVar162._12_4_ + fVar194 * auVar8._12_4_;
  auVar336 = ZEXT1664(auVar333);
  auVar343._0_4_ = fVar176 * auVar9._0_4_ + fVar256 * auVar83._0_4_ + auVar108._0_4_ * fVar155;
  auVar343._4_4_ = fVar195 * auVar9._4_4_ + fVar267 * auVar83._4_4_ + auVar108._4_4_ * fVar178;
  auVar343._8_4_ = fVar177 * auVar9._8_4_ + fVar272 * auVar83._8_4_ + auVar108._8_4_ * fVar175;
  auVar343._12_4_ = fVar196 * auVar9._12_4_ + fVar277 * auVar83._12_4_ + auVar108._12_4_ * fVar194;
  auVar246._0_4_ = fVar176 * auVar82._0_4_ + fVar256 * auVar78._0_4_ + auVar106._0_4_ * fVar155;
  auVar246._4_4_ = fVar195 * auVar82._4_4_ + fVar267 * auVar78._4_4_ + auVar106._4_4_ * fVar178;
  auVar246._8_4_ = fVar177 * auVar82._8_4_ + fVar272 * auVar78._8_4_ + auVar106._8_4_ * fVar175;
  auVar246._12_4_ = fVar196 * auVar82._12_4_ + fVar277 * auVar78._12_4_ + auVar106._12_4_ * fVar194;
  auVar85 = vshufps_avx(auVar134,auVar134,0);
  auVar318 = ZEXT1664(auVar85);
  auVar105 = vshufps_avx(auVar134,auVar134,0x55);
  auVar135 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar155 = auVar135._0_4_;
  fVar178 = auVar135._4_4_;
  fVar175 = auVar135._8_4_;
  fVar194 = auVar135._12_4_;
  fVar256 = auVar105._0_4_;
  fVar267 = auVar105._4_4_;
  fVar272 = auVar105._8_4_;
  fVar277 = auVar105._12_4_;
  fVar176 = auVar85._0_4_;
  fVar195 = auVar85._4_4_;
  fVar177 = auVar85._8_4_;
  fVar196 = auVar85._12_4_;
  auVar197._0_4_ = fVar176 * auVar88._0_4_ + fVar256 * auVar162._0_4_ + fVar155 * auVar8._0_4_;
  auVar197._4_4_ = fVar195 * auVar88._4_4_ + fVar267 * auVar162._4_4_ + fVar178 * auVar8._4_4_;
  auVar197._8_4_ = fVar177 * auVar88._8_4_ + fVar272 * auVar162._8_4_ + fVar175 * auVar8._8_4_;
  auVar197._12_4_ = fVar196 * auVar88._12_4_ + fVar277 * auVar162._12_4_ + fVar194 * auVar8._12_4_;
  auVar105._0_4_ = fVar176 * auVar9._0_4_ + auVar108._0_4_ * fVar155 + fVar256 * auVar83._0_4_;
  auVar105._4_4_ = fVar195 * auVar9._4_4_ + auVar108._4_4_ * fVar178 + fVar267 * auVar83._4_4_;
  auVar105._8_4_ = fVar177 * auVar9._8_4_ + auVar108._8_4_ * fVar175 + fVar272 * auVar83._8_4_;
  auVar105._12_4_ = fVar196 * auVar9._12_4_ + auVar108._12_4_ * fVar194 + fVar277 * auVar83._12_4_;
  auVar85._0_4_ = fVar176 * auVar82._0_4_ + fVar256 * auVar78._0_4_ + auVar106._0_4_ * fVar155;
  auVar85._4_4_ = fVar195 * auVar82._4_4_ + fVar267 * auVar78._4_4_ + auVar106._4_4_ * fVar178;
  auVar85._8_4_ = fVar177 * auVar82._8_4_ + fVar272 * auVar78._8_4_ + auVar106._8_4_ * fVar175;
  auVar85._12_4_ = fVar196 * auVar82._12_4_ + fVar277 * auVar78._12_4_ + auVar106._12_4_ * fVar194;
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar88 = vandps_avx(auVar333,auVar219);
  auVar156._8_4_ = 0x219392ef;
  auVar156._0_8_ = 0x219392ef219392ef;
  auVar156._12_4_ = 0x219392ef;
  auVar88 = vcmpps_avx(auVar88,auVar156,1);
  auVar162 = vblendvps_avx(auVar333,auVar156,auVar88);
  auVar88 = vandps_avx(auVar343,auVar219);
  auVar88 = vcmpps_avx(auVar88,auVar156,1);
  auVar8 = vblendvps_avx(auVar343,auVar156,auVar88);
  auVar88 = vandps_avx(auVar246,auVar219);
  auVar88 = vcmpps_avx(auVar88,auVar156,1);
  auVar88 = vblendvps_avx(auVar246,auVar156,auVar88);
  auVar9 = vrcpps_avx(auVar162);
  fVar256 = auVar9._0_4_;
  auVar135._0_4_ = fVar256 * auVar162._0_4_;
  fVar267 = auVar9._4_4_;
  auVar135._4_4_ = fVar267 * auVar162._4_4_;
  fVar272 = auVar9._8_4_;
  auVar135._8_4_ = fVar272 * auVar162._8_4_;
  fVar277 = auVar9._12_4_;
  auVar135._12_4_ = fVar277 * auVar162._12_4_;
  auVar247._8_4_ = 0x3f800000;
  auVar247._0_8_ = 0x3f8000003f800000;
  auVar247._12_4_ = 0x3f800000;
  auVar162 = vsubps_avx(auVar247,auVar135);
  fVar256 = fVar256 + fVar256 * auVar162._0_4_;
  fVar267 = fVar267 + fVar267 * auVar162._4_4_;
  fVar272 = fVar272 + fVar272 * auVar162._8_4_;
  fVar277 = fVar277 + fVar277 * auVar162._12_4_;
  auVar162 = vrcpps_avx(auVar8);
  fVar155 = auVar162._0_4_;
  auVar157._0_4_ = fVar155 * auVar8._0_4_;
  fVar175 = auVar162._4_4_;
  auVar157._4_4_ = fVar175 * auVar8._4_4_;
  fVar176 = auVar162._8_4_;
  auVar157._8_4_ = fVar176 * auVar8._8_4_;
  fVar177 = auVar162._12_4_;
  auVar157._12_4_ = fVar177 * auVar8._12_4_;
  auVar162 = vsubps_avx(auVar247,auVar157);
  fVar155 = fVar155 + fVar155 * auVar162._0_4_;
  fVar175 = fVar175 + fVar175 * auVar162._4_4_;
  fVar176 = fVar176 + fVar176 * auVar162._8_4_;
  fVar177 = fVar177 + fVar177 * auVar162._12_4_;
  auVar162 = vrcpps_avx(auVar88);
  fVar178 = auVar162._0_4_;
  auVar179._0_4_ = fVar178 * auVar88._0_4_;
  fVar194 = auVar162._4_4_;
  auVar179._4_4_ = fVar194 * auVar88._4_4_;
  fVar195 = auVar162._8_4_;
  auVar179._8_4_ = fVar195 * auVar88._8_4_;
  fVar196 = auVar162._12_4_;
  auVar179._12_4_ = fVar196 * auVar88._12_4_;
  auVar162 = vsubps_avx(auVar247,auVar179);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar88 = vpmovsxwd_avx(auVar88);
  fVar178 = fVar178 + fVar178 * auVar162._0_4_;
  fVar194 = fVar194 + fVar194 * auVar162._4_4_;
  fVar195 = fVar195 + fVar195 * auVar162._8_4_;
  fVar196 = fVar196 + fVar196 * auVar162._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar197);
  auVar136._0_4_ = fVar256 * auVar88._0_4_;
  auVar136._4_4_ = fVar267 * auVar88._4_4_;
  auVar136._8_4_ = fVar272 * auVar88._8_4_;
  auVar136._12_4_ = fVar277 * auVar88._12_4_;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar88 = vpmovsxwd_avx(auVar162);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar162 = vsubps_avx(auVar88,auVar197);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar69 * 0xe + 6);
  auVar88 = vpmovsxwd_avx(auVar8);
  auVar198._0_4_ = fVar256 * auVar162._0_4_;
  auVar198._4_4_ = fVar267 * auVar162._4_4_;
  auVar198._8_4_ = fVar272 * auVar162._8_4_;
  auVar198._12_4_ = fVar277 * auVar162._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar105);
  auVar220._0_4_ = auVar88._0_4_ * fVar155;
  auVar220._4_4_ = auVar88._4_4_ * fVar175;
  auVar220._8_4_ = auVar88._8_4_ * fVar176;
  auVar220._12_4_ = auVar88._12_4_ * fVar177;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar88 = vpmovsxwd_avx(auVar9);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar105);
  auVar106._0_4_ = fVar155 * auVar88._0_4_;
  auVar106._4_4_ = fVar175 * auVar88._4_4_;
  auVar106._8_4_ = fVar176 * auVar88._8_4_;
  auVar106._12_4_ = fVar177 * auVar88._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 0x15 + 6);
  auVar88 = vpmovsxwd_avx(auVar83);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar162 = vsubps_avx(auVar88,auVar85);
  local_808 = prim;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 6);
  auVar88 = vpmovsxwd_avx(auVar108);
  auVar158._0_4_ = auVar162._0_4_ * fVar178;
  auVar158._4_4_ = auVar162._4_4_ * fVar194;
  auVar158._8_4_ = auVar162._8_4_ * fVar195;
  auVar158._12_4_ = auVar162._12_4_ * fVar196;
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar85);
  auVar82._0_4_ = auVar88._0_4_ * fVar178;
  auVar82._4_4_ = auVar88._4_4_ * fVar194;
  auVar82._8_4_ = auVar88._8_4_ * fVar195;
  auVar82._12_4_ = auVar88._12_4_ * fVar196;
  auVar88 = vpminsd_avx(auVar136,auVar198);
  auVar162 = vpminsd_avx(auVar220,auVar106);
  auVar88 = vmaxps_avx(auVar88,auVar162);
  auVar162 = vpminsd_avx(auVar158,auVar82);
  uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar296._4_4_ = uVar75;
  auVar296._0_4_ = uVar75;
  auVar296._8_4_ = uVar75;
  auVar296._12_4_ = uVar75;
  auVar162 = vmaxps_avx(auVar162,auVar296);
  auVar88 = vmaxps_avx(auVar88,auVar162);
  local_600._0_4_ = auVar88._0_4_ * 0.99999964;
  local_600._4_4_ = auVar88._4_4_ * 0.99999964;
  local_600._8_4_ = auVar88._8_4_ * 0.99999964;
  local_600._12_4_ = auVar88._12_4_ * 0.99999964;
  auVar88 = vpmaxsd_avx(auVar136,auVar198);
  auVar162 = vpmaxsd_avx(auVar220,auVar106);
  auVar88 = vminps_avx(auVar88,auVar162);
  auVar162 = vpmaxsd_avx(auVar158,auVar82);
  fVar155 = (ray->super_RayK<1>).tfar;
  auVar137._4_4_ = fVar155;
  auVar137._0_4_ = fVar155;
  auVar137._8_4_ = fVar155;
  auVar137._12_4_ = fVar155;
  auVar162 = vminps_avx(auVar162,auVar137);
  auVar88 = vminps_avx(auVar88,auVar162);
  auVar162 = vpshufd_avx(ZEXT116((byte)PVar4),0);
  auVar162 = vpcmpgtd_avx(auVar162,_DAT_01f4ad30);
  auVar78._0_4_ = auVar88._0_4_ * 1.0000004;
  auVar78._4_4_ = auVar88._4_4_ * 1.0000004;
  auVar78._8_4_ = auVar88._8_4_ * 1.0000004;
  auVar78._12_4_ = auVar88._12_4_ * 1.0000004;
  auVar88 = vcmpps_avx(local_600,auVar78,2);
  auVar88 = vandps_avx(auVar88,auVar162);
  uVar67 = vmovmskps_avx(auVar88);
  auVar89._16_16_ = mm_lookupmask_ps._240_16_;
  auVar89._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,0x80);
LAB_007a83fb:
  uVar76 = (ulong)uVar67;
  if (uVar76 == 0) {
    return;
  }
  lVar70 = 0;
  if (uVar76 != 0) {
    for (; (uVar67 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
    }
  }
  uVar76 = uVar76 - 1 & uVar76;
  uVar75 = *(undefined4 *)(local_808 + lVar70 * 4 + 6);
  lVar70 = lVar70 * 0x40;
  lVar7 = 0;
  if (uVar76 != 0) {
    for (; (uVar76 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  uVar67 = *(uint *)(local_808 + 2);
  auVar88 = *(undefined1 (*) [16])(prim + lVar70 + uVar69 * 0x19 + 0x16);
  if (((uVar76 != 0) && (uVar73 = uVar76 - 1 & uVar76, uVar73 != 0)) && (lVar7 = 0, uVar73 != 0)) {
    for (; (uVar73 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  auVar162 = *(undefined1 (*) [16])(prim + lVar70 + uVar69 * 0x19 + 0x26);
  auVar8 = *(undefined1 (*) [16])(prim + lVar70 + uVar69 * 0x19 + 0x36);
  auVar9 = *(undefined1 (*) [16])(prim + lVar70 + uVar69 * 0x19 + 0x46);
  auVar79._0_4_ = (auVar88._0_4_ + auVar162._0_4_ + auVar8._0_4_ + auVar9._0_4_) * 0.25;
  auVar79._4_4_ = (auVar88._4_4_ + auVar162._4_4_ + auVar8._4_4_ + auVar9._4_4_) * 0.25;
  auVar79._8_4_ = (auVar88._8_4_ + auVar162._8_4_ + auVar8._8_4_ + auVar9._8_4_) * 0.25;
  auVar79._12_4_ = (auVar88._12_4_ + auVar162._12_4_ + auVar8._12_4_ + auVar9._12_4_) * 0.25;
  aVar2 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar83 = vsubps_avx(auVar79,(undefined1  [16])aVar2);
  auVar83 = vdpps_avx(auVar83,(undefined1  [16])aVar3,0x7f);
  auVar108 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar82 = vrcpss_avx(auVar108,auVar108);
  auVar298 = ZEXT464(0x40000000);
  fVar155 = auVar83._0_4_ * auVar82._0_4_ * (2.0 - auVar82._0_4_ * auVar108._0_4_);
  local_820 = ZEXT416((uint)fVar155);
  auVar108 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
  fVar155 = aVar3.x;
  fVar178 = aVar3.y;
  fVar175 = aVar3.z;
  aVar131 = aVar3.field_3;
  auVar221._0_4_ = aVar2.x + fVar155 * auVar108._0_4_;
  auVar221._4_4_ = aVar2.y + fVar178 * auVar108._4_4_;
  auVar221._8_4_ = aVar2.z + fVar175 * auVar108._8_4_;
  auVar221._12_4_ = aVar2.field_3.w + aVar131.w * auVar108._12_4_;
  auVar83 = vblendps_avx(auVar221,_DAT_01f45a50,8);
  _local_990 = vsubps_avx(auVar88,auVar83);
  auVar249 = ZEXT1664(_local_990);
  _local_9a0 = vsubps_avx(auVar8,auVar83);
  _local_9b0 = vsubps_avx(auVar162,auVar83);
  _local_9c0 = vsubps_avx(auVar9,auVar83);
  auVar213 = ZEXT1664(_local_9c0);
  auVar88 = vshufps_avx(_local_990,_local_990,0);
  auVar162 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar162;
  _local_1e0 = auVar162;
  auVar162 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar162;
  _local_200 = auVar162;
  auVar162 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001290 = auVar162;
  _local_220 = auVar162;
  auVar162 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001290 = auVar162;
  _local_240 = auVar162;
  auVar162 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001290 = auVar162;
  _local_260 = auVar162;
  auVar162 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001290 = auVar162;
  _local_280 = auVar162;
  auVar107._0_4_ = fVar155 * fVar155;
  auVar107._4_4_ = fVar178 * fVar178;
  auVar107._8_4_ = fVar175 * fVar175;
  auVar107._12_4_ = aVar131.w * aVar131.w;
  auVar162 = vshufps_avx(auVar107,auVar107,0xaa);
  auVar8 = vshufps_avx(auVar107,auVar107,0x55);
  auVar9 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  register0x000012d0 = auVar9;
  _local_3e0 = auVar9;
  auVar9 = vshufps_avx(auVar107,auVar107,0);
  local_2a0._0_4_ = auVar9._0_4_ + auVar8._0_4_ + auVar162._0_4_;
  local_2a0._4_4_ = auVar9._4_4_ + auVar8._4_4_ + auVar162._4_4_;
  local_2a0._8_4_ = auVar9._8_4_ + auVar8._8_4_ + auVar162._8_4_;
  local_2a0._12_4_ = auVar9._12_4_ + auVar8._12_4_ + auVar162._12_4_;
  local_2a0._16_4_ = auVar9._0_4_ + auVar8._0_4_ + auVar162._0_4_;
  local_2a0._20_4_ = auVar9._4_4_ + auVar8._4_4_ + auVar162._4_4_;
  local_2a0._24_4_ = auVar9._8_4_ + auVar8._8_4_ + auVar162._8_4_;
  local_2a0._28_4_ = auVar9._12_4_ + auVar8._12_4_ + auVar162._12_4_;
  auVar162 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001250 = auVar162;
  _local_400 = auVar162;
  auVar162 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001250 = auVar162;
  _local_420 = auVar162;
  auVar162 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar162;
  _local_440 = auVar162;
  auVar162 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar162;
  _local_460 = auVar162;
  auVar162 = vshufps_avx(_local_9c0,_local_9c0,0);
  register0x00001250 = auVar162;
  _local_480 = auVar162;
  auVar162 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  register0x00001250 = auVar162;
  _local_4a0 = auVar162;
  auVar162 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001250 = auVar162;
  _local_4c0 = auVar162;
  auVar162 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  register0x00001250 = auVar162;
  _local_4e0 = auVar162;
  local_800._16_16_ = auVar108;
  local_800._0_16_ = auVar108;
  uVar73 = 0;
  local_b0c = 1;
  local_620 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  local_640 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  local_660 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar90._8_4_ = 0x7fffffff;
  auVar90._0_8_ = 0x7fffffff7fffffff;
  auVar90._12_4_ = 0x7fffffff;
  auVar90._16_4_ = 0x7fffffff;
  auVar90._20_4_ = 0x7fffffff;
  auVar90._24_4_ = 0x7fffffff;
  auVar90._28_4_ = 0x7fffffff;
  local_500 = vandps_avx(local_2a0,auVar90);
  local_5f0 = ZEXT816(0x3f80000000000000);
  auVar89 = local_2a0;
  do {
    auVar162 = vmovshdup_avx(local_5f0);
    auVar9 = vsubps_avx(auVar162,local_5f0);
    auVar162 = vshufps_avx(local_5f0,local_5f0,0);
    local_760._16_16_ = auVar162;
    local_760._0_16_ = auVar162;
    auVar8 = vshufps_avx(auVar9,auVar9,0);
    local_780._16_16_ = auVar8;
    local_780._0_16_ = auVar8;
    fVar104 = auVar8._0_4_;
    fVar129 = auVar8._4_4_;
    fVar130 = auVar8._8_4_;
    fVar132 = auVar8._12_4_;
    fVar133 = auVar162._0_4_;
    auVar170._0_4_ = fVar133 + fVar104 * 0.0;
    fVar152 = auVar162._4_4_;
    auVar170._4_4_ = fVar152 + fVar129 * 0.14285715;
    fVar153 = auVar162._8_4_;
    auVar170._8_4_ = fVar153 + fVar130 * 0.2857143;
    fVar154 = auVar162._12_4_;
    auVar170._12_4_ = fVar154 + fVar132 * 0.42857146;
    auVar170._16_4_ = fVar133 + fVar104 * 0.5714286;
    auVar170._20_4_ = fVar152 + fVar129 * 0.71428573;
    auVar170._24_4_ = fVar153 + fVar130 * 0.8571429;
    auVar170._28_4_ = fVar154 + fVar132;
    auVar117._8_4_ = 0x3f800000;
    auVar117._0_8_ = 0x3f8000003f800000;
    auVar117._12_4_ = 0x3f800000;
    auVar117._16_4_ = 0x3f800000;
    auVar117._20_4_ = 0x3f800000;
    auVar117._24_4_ = 0x3f800000;
    auVar117._28_4_ = 0x3f800000;
    auVar90 = vsubps_avx(auVar117,auVar170);
    fVar178 = auVar90._0_4_;
    fVar175 = auVar90._4_4_;
    fVar194 = auVar90._8_4_;
    fVar176 = auVar90._12_4_;
    fVar195 = auVar90._16_4_;
    fVar177 = auVar90._20_4_;
    fVar196 = auVar90._24_4_;
    fVar217 = fVar178 * fVar178 * fVar178;
    fVar226 = fVar175 * fVar175 * fVar175;
    fVar229 = fVar194 * fVar194 * fVar194;
    fVar232 = fVar176 * fVar176 * fVar176;
    fVar235 = fVar195 * fVar195 * fVar195;
    fVar238 = fVar177 * fVar177 * fVar177;
    fVar241 = fVar196 * fVar196 * fVar196;
    fVar244 = auVar170._0_4_ * auVar170._0_4_ * auVar170._0_4_;
    fVar250 = auVar170._4_4_ * auVar170._4_4_ * auVar170._4_4_;
    fVar251 = auVar170._8_4_ * auVar170._8_4_ * auVar170._8_4_;
    fVar252 = auVar170._12_4_ * auVar170._12_4_ * auVar170._12_4_;
    fVar253 = auVar170._16_4_ * auVar170._16_4_ * auVar170._16_4_;
    fVar254 = auVar170._20_4_ * auVar170._20_4_ * auVar170._20_4_;
    fVar255 = auVar170._24_4_ * auVar170._24_4_ * auVar170._24_4_;
    fVar155 = auVar213._28_4_;
    fVar256 = auVar170._0_4_ * fVar178;
    fVar267 = auVar170._4_4_ * fVar175;
    fVar272 = auVar170._8_4_ * fVar194;
    fVar277 = auVar170._12_4_ * fVar176;
    fVar214 = auVar170._16_4_ * fVar195;
    fVar215 = auVar170._20_4_ * fVar177;
    fVar216 = auVar170._24_4_ * fVar196;
    fVar313 = auVar306._28_4_ + auVar336._28_4_;
    fVar294 = auVar249._28_4_ + fVar155 + fVar313;
    fVar299 = fVar313 + auVar89._28_4_ + auVar318._28_4_ + auVar298._28_4_;
    fVar313 = fVar217 * 0.16666667;
    fVar227 = fVar226 * 0.16666667;
    fVar230 = fVar229 * 0.16666667;
    fVar233 = fVar232 * 0.16666667;
    fVar236 = fVar235 * 0.16666667;
    fVar239 = fVar238 * 0.16666667;
    fVar242 = fVar241 * 0.16666667;
    fVar257 = (fVar244 + fVar217 * 4.0 + fVar178 * fVar256 * 12.0 + auVar170._0_4_ * fVar256 * 6.0)
              * 0.16666667;
    fVar268 = (fVar250 + fVar226 * 4.0 + fVar175 * fVar267 * 12.0 + auVar170._4_4_ * fVar267 * 6.0)
              * 0.16666667;
    fVar273 = (fVar251 + fVar229 * 4.0 + fVar194 * fVar272 * 12.0 + auVar170._8_4_ * fVar272 * 6.0)
              * 0.16666667;
    fVar278 = (fVar252 + fVar232 * 4.0 + fVar176 * fVar277 * 12.0 + auVar170._12_4_ * fVar277 * 6.0)
              * 0.16666667;
    fVar282 = (fVar253 + fVar235 * 4.0 + fVar195 * fVar214 * 12.0 + auVar170._16_4_ * fVar214 * 6.0)
              * 0.16666667;
    fVar286 = (fVar254 + fVar238 * 4.0 + fVar177 * fVar215 * 12.0 + auVar170._20_4_ * fVar215 * 6.0)
              * 0.16666667;
    fVar290 = (fVar255 + fVar241 * 4.0 + fVar196 * fVar216 * 12.0 + auVar170._24_4_ * fVar216 * 6.0)
              * 0.16666667;
    fVar217 = (fVar244 * 4.0 + fVar217 + auVar170._0_4_ * fVar256 * 12.0 + fVar178 * fVar256 * 6.0)
              * 0.16666667;
    fVar226 = (fVar250 * 4.0 + fVar226 + auVar170._4_4_ * fVar267 * 12.0 + fVar175 * fVar267 * 6.0)
              * 0.16666667;
    fVar229 = (fVar251 * 4.0 + fVar229 + auVar170._8_4_ * fVar272 * 12.0 + fVar194 * fVar272 * 6.0)
              * 0.16666667;
    fVar232 = (fVar252 * 4.0 + fVar232 + auVar170._12_4_ * fVar277 * 12.0 + fVar176 * fVar277 * 6.0)
              * 0.16666667;
    fVar235 = (fVar253 * 4.0 + fVar235 + auVar170._16_4_ * fVar214 * 12.0 + fVar195 * fVar214 * 6.0)
              * 0.16666667;
    fVar238 = (fVar254 * 4.0 + fVar238 + auVar170._20_4_ * fVar215 * 12.0 + fVar177 * fVar215 * 6.0)
              * 0.16666667;
    fVar241 = (fVar255 * 4.0 + fVar241 + auVar170._24_4_ * fVar216 * 12.0 + fVar196 * fVar216 * 6.0)
              * 0.16666667;
    fVar244 = fVar244 * 0.16666667;
    fVar250 = fVar250 * 0.16666667;
    fVar251 = fVar251 * 0.16666667;
    fVar252 = fVar252 * 0.16666667;
    fVar253 = fVar253 * 0.16666667;
    fVar254 = fVar254 * 0.16666667;
    fVar255 = fVar255 * 0.16666667;
    fVar331 = auVar318._28_4_ + 12.0;
    fVar300 = fVar299 + 12.166667;
    fVar100 = auVar88._0_4_;
    fVar101 = auVar88._4_4_;
    fVar102 = auVar88._8_4_;
    local_860 = fVar100 * fVar313 +
                fVar257 * (float)local_240._0_4_ +
                fVar244 * (float)local_480._0_4_ + fVar217 * (float)local_400._0_4_;
    fStack_85c = fVar101 * fVar227 +
                 fVar268 * (float)local_240._4_4_ +
                 fVar250 * (float)local_480._4_4_ + fVar226 * (float)local_400._4_4_;
    fStack_858 = fVar102 * fVar230 +
                 fVar273 * fStack_238 + fVar251 * fStack_478 + fVar229 * fStack_3f8;
    fStack_854 = auVar88._12_4_ * fVar233 +
                 fVar278 * fStack_234 + fVar252 * fStack_474 + fVar232 * fStack_3f4;
    fStack_850 = fVar100 * fVar236 +
                 fVar282 * fStack_230 + fVar253 * fStack_470 + fVar235 * fStack_3f0;
    fStack_84c = fVar101 * fVar239 +
                 fVar286 * fStack_22c + fVar254 * fStack_46c + fVar238 * fStack_3ec;
    fStack_848 = fVar102 * fVar242 +
                 fVar290 * fStack_228 + fVar255 * fStack_468 + fVar241 * fStack_3e8;
    fStack_844 = fVar294 + fVar300;
    fVar258 = (float)local_1e0._0_4_ * fVar313 +
              (float)local_260._0_4_ * fVar257 +
              fVar244 * (float)local_4a0._0_4_ + fVar217 * (float)local_420._0_4_;
    fVar269 = (float)local_1e0._4_4_ * fVar227 +
              (float)local_260._4_4_ * fVar268 +
              fVar250 * (float)local_4a0._4_4_ + fVar226 * (float)local_420._4_4_;
    fVar274 = fStack_1d8 * fVar230 +
              fStack_258 * fVar273 + fVar251 * fStack_498 + fVar229 * fStack_418;
    fVar279 = fStack_1d4 * fVar233 +
              fStack_254 * fVar278 + fVar252 * fStack_494 + fVar232 * fStack_414;
    fVar283 = fStack_1d0 * fVar236 +
              fStack_250 * fVar282 + fVar253 * fStack_490 + fVar235 * fStack_410;
    fVar287 = fStack_1cc * fVar239 +
              fStack_24c * fVar286 + fVar254 * fStack_48c + fVar238 * fStack_40c;
    fVar291 = fStack_1c8 * fVar242 +
              fStack_248 * fVar290 + fVar255 * fStack_488 + fVar241 * fStack_408;
    fVar295 = fStack_844 + fVar331 + 12.166667;
    local_840 = (float)local_200._0_4_ * fVar313 +
                (float)local_280._0_4_ * fVar257 +
                fVar244 * (float)local_4c0._0_4_ + fVar217 * (float)local_440._0_4_;
    fStack_83c = (float)local_200._4_4_ * fVar227 +
                 (float)local_280._4_4_ * fVar268 +
                 fVar250 * (float)local_4c0._4_4_ + fVar226 * (float)local_440._4_4_;
    fStack_838 = fStack_1f8 * fVar230 +
                 fStack_278 * fVar273 + fVar251 * fStack_4b8 + fVar229 * fStack_438;
    aStack_834.w = fStack_1f4 * fVar233 +
                   fStack_274 * fVar278 + fVar252 * fStack_4b4 + fVar232 * fStack_434;
    fStack_830 = fStack_1f0 * fVar236 +
                 fStack_270 * fVar282 + fVar253 * fStack_4b0 + fVar235 * fStack_430;
    fStack_82c = fStack_1ec * fVar239 +
                 fStack_26c * fVar286 + fVar254 * fStack_4ac + fVar238 * fStack_42c;
    fStack_828 = fStack_1e8 * fVar242 +
                 fStack_268 * fVar290 + fVar255 * fStack_4a8 + fVar241 * fStack_428;
    fStack_824 = fVar295 + fVar331 + auVar336._28_4_ + 12.0;
    local_ae0._0_4_ =
         (float)local_220._0_4_ * fVar313 +
         fVar257 * (float)local_3e0._0_4_ +
         fVar217 * (float)local_460._0_4_ + fVar244 * (float)local_4e0._0_4_;
    local_ae0._4_4_ =
         (float)local_220._4_4_ * fVar227 +
         fVar268 * (float)local_3e0._4_4_ +
         fVar226 * (float)local_460._4_4_ + fVar250 * (float)local_4e0._4_4_;
    fStack_ad8 = fStack_218 * fVar230 +
                 fVar273 * fStack_3d8 + fVar229 * fStack_458 + fVar251 * fStack_4d8;
    fStack_ad4 = fStack_214 * fVar233 +
                 fVar278 * fStack_3d4 + fVar232 * fStack_454 + fVar252 * fStack_4d4;
    fStack_ad0 = fStack_210 * fVar236 +
                 fVar282 * fStack_3d0 + fVar235 * fStack_450 + fVar253 * fStack_4d0;
    fStack_acc = fStack_20c * fVar239 +
                 fVar286 * fStack_3cc + fVar238 * fStack_44c + fVar254 * fStack_4cc;
    fStack_ac8 = fStack_208 * fVar242 +
                 fVar290 * fStack_3c8 + fVar241 * fStack_448 + fVar255 * fStack_4c8;
    fStack_ac4 = auVar89._28_4_ + fVar294 + fVar299 + auVar249._28_4_;
    auVar10._4_4_ = auVar170._4_4_ * -auVar170._4_4_;
    auVar10._0_4_ = auVar170._0_4_ * -auVar170._0_4_;
    auVar10._8_4_ = auVar170._8_4_ * -auVar170._8_4_;
    auVar10._12_4_ = auVar170._12_4_ * -auVar170._12_4_;
    auVar10._16_4_ = auVar170._16_4_ * -auVar170._16_4_;
    auVar10._20_4_ = auVar170._20_4_ * -auVar170._20_4_;
    auVar10._24_4_ = auVar170._24_4_ * -auVar170._24_4_;
    auVar10._28_4_ = auVar170._28_4_;
    auVar12._4_4_ = fVar267 * 4.0;
    auVar12._0_4_ = fVar256 * 4.0;
    auVar12._8_4_ = fVar272 * 4.0;
    auVar12._12_4_ = fVar277 * 4.0;
    auVar12._16_4_ = fVar214 * 4.0;
    auVar12._20_4_ = fVar215 * 4.0;
    auVar12._24_4_ = fVar216 * 4.0;
    auVar12._28_4_ = fVar155;
    auVar89 = vsubps_avx(auVar10,auVar12);
    fVar241 = fVar178 * -fVar178 * 0.5;
    fVar242 = fVar175 * -fVar175 * 0.5;
    fVar244 = fVar194 * -fVar194 * 0.5;
    fVar250 = fVar176 * -fVar176 * 0.5;
    fVar251 = fVar195 * -fVar195 * 0.5;
    fVar252 = fVar177 * -fVar177 * 0.5;
    fVar253 = fVar196 * -fVar196 * 0.5;
    fVar229 = auVar89._0_4_ * 0.5;
    fVar230 = auVar89._4_4_ * 0.5;
    fVar232 = auVar89._8_4_ * 0.5;
    fVar235 = auVar89._12_4_ * 0.5;
    fVar236 = auVar89._16_4_ * 0.5;
    fVar238 = auVar89._20_4_ * 0.5;
    fVar239 = auVar89._24_4_ * 0.5;
    fVar217 = (fVar178 * fVar178 + fVar256 * 4.0) * 0.5;
    fVar313 = (fVar175 * fVar175 + fVar267 * 4.0) * 0.5;
    fVar226 = (fVar194 * fVar194 + fVar272 * 4.0) * 0.5;
    fVar227 = (fVar176 * fVar176 + fVar277 * 4.0) * 0.5;
    fVar214 = (fVar195 * fVar195 + fVar214 * 4.0) * 0.5;
    fVar215 = (fVar177 * fVar177 + fVar215 * 4.0) * 0.5;
    fVar216 = (fVar196 * fVar196 + fVar216 * 4.0) * 0.5;
    fVar178 = auVar170._0_4_ * auVar170._0_4_ * 0.5;
    fVar175 = auVar170._4_4_ * auVar170._4_4_ * 0.5;
    fVar194 = auVar170._8_4_ * auVar170._8_4_ * 0.5;
    fVar196 = auVar170._12_4_ * auVar170._12_4_ * 0.5;
    fVar256 = auVar170._16_4_ * auVar170._16_4_ * 0.5;
    fVar267 = auVar170._20_4_ * auVar170._20_4_ * 0.5;
    fVar277 = auVar170._24_4_ * auVar170._24_4_ * 0.5;
    fVar233 = auVar89._28_4_ + fVar154 + fVar155 + fVar300 + fVar155;
    auVar162 = vpermilps_avx(ZEXT416((uint)(auVar9._0_4_ * 0.04761905)),0);
    fVar176 = auVar162._0_4_;
    fVar259 = fVar176 * (fVar100 * fVar241 +
                        (float)local_240._0_4_ * fVar229 +
                        fVar217 * (float)local_400._0_4_ + fVar178 * (float)local_480._0_4_);
    fVar195 = auVar162._4_4_;
    fVar270 = fVar195 * (fVar101 * fVar242 +
                        (float)local_240._4_4_ * fVar230 +
                        fVar313 * (float)local_400._4_4_ + fVar175 * (float)local_480._4_4_);
    local_9e0._4_4_ = fVar270;
    local_9e0._0_4_ = fVar259;
    fVar177 = auVar162._8_4_;
    fVar275 = fVar177 * (fVar102 * fVar244 +
                        fStack_238 * fVar232 + fVar226 * fStack_3f8 + fVar194 * fStack_478);
    local_9e0._8_4_ = fVar275;
    fVar272 = auVar162._12_4_;
    fVar280 = fVar272 * (auVar88._12_4_ * fVar250 +
                        fStack_234 * fVar235 + fVar227 * fStack_3f4 + fVar196 * fStack_474);
    local_9e0._12_4_ = fVar280;
    fVar284 = fVar176 * (fVar100 * fVar251 +
                        fStack_230 * fVar236 + fVar214 * fStack_3f0 + fVar256 * fStack_470);
    local_9e0._16_4_ = fVar284;
    fVar288 = fVar195 * (fVar101 * fVar252 +
                        fStack_22c * fVar238 + fVar215 * fStack_3ec + fVar267 * fStack_46c);
    local_9e0._20_4_ = fVar288;
    fVar292 = fVar177 * (fVar102 * fVar253 +
                        fStack_228 * fVar239 + fVar216 * fStack_3e8 + fVar277 * fStack_468);
    local_9e0._24_4_ = fVar292;
    local_9e0._28_4_ = fStack_824 + fVar300;
    fVar301 = fVar176 * ((float)local_1e0._0_4_ * fVar241 +
                        (float)local_260._0_4_ * fVar229 +
                        fVar217 * (float)local_420._0_4_ + fVar178 * (float)local_4a0._0_4_);
    fVar307 = fVar195 * ((float)local_1e0._4_4_ * fVar242 +
                        (float)local_260._4_4_ * fVar230 +
                        fVar313 * (float)local_420._4_4_ + fVar175 * (float)local_4a0._4_4_);
    local_980._4_4_ = fVar307;
    local_980._0_4_ = fVar301;
    fVar308 = fVar177 * (fStack_1d8 * fVar244 +
                        fStack_258 * fVar232 + fVar226 * fStack_418 + fVar194 * fStack_498);
    local_980._8_4_ = fVar308;
    fVar309 = fVar272 * (fStack_1d4 * fVar250 +
                        fStack_254 * fVar235 + fVar227 * fStack_414 + fVar196 * fStack_494);
    local_980._12_4_ = fVar309;
    fVar310 = fVar176 * (fStack_1d0 * fVar251 +
                        fStack_250 * fVar236 + fVar214 * fStack_410 + fVar256 * fStack_490);
    local_980._16_4_ = fVar310;
    fVar311 = fVar195 * (fStack_1cc * fVar252 +
                        fStack_24c * fVar238 + fVar215 * fStack_40c + fVar267 * fStack_48c);
    local_980._20_4_ = fVar311;
    fVar312 = fVar177 * (fStack_1c8 * fVar253 +
                        fStack_248 * fVar239 + fVar216 * fStack_408 + fVar277 * fStack_488);
    local_980._24_4_ = fVar312;
    local_980._28_4_ = uStack_1e4;
    fVar314 = fVar176 * ((float)local_200._0_4_ * fVar241 +
                        fVar178 * (float)local_4c0._0_4_ + fVar217 * (float)local_440._0_4_ +
                        (float)local_280._0_4_ * fVar229);
    fVar319 = fVar195 * ((float)local_200._4_4_ * fVar242 +
                        fVar175 * (float)local_4c0._4_4_ + fVar313 * (float)local_440._4_4_ +
                        (float)local_280._4_4_ * fVar230);
    local_900._4_4_ = fVar319;
    local_900._0_4_ = fVar314;
    fVar321 = fVar177 * (fStack_1f8 * fVar244 +
                        fVar194 * fStack_4b8 + fVar226 * fStack_438 + fStack_278 * fVar232);
    local_900._8_4_ = fVar321;
    fVar323 = fVar272 * (fStack_1f4 * fVar250 +
                        fVar196 * fStack_4b4 + fVar227 * fStack_434 + fStack_274 * fVar235);
    local_900._12_4_ = fVar323;
    fVar325 = fVar176 * (fStack_1f0 * fVar251 +
                        fVar256 * fStack_4b0 + fVar214 * fStack_430 + fStack_270 * fVar236);
    local_900._16_4_ = fVar325;
    fVar327 = fVar195 * (fStack_1ec * fVar252 +
                        fVar267 * fStack_4ac + fVar215 * fStack_42c + fStack_26c * fVar238);
    local_900._20_4_ = fVar327;
    fVar329 = fVar177 * (fStack_1e8 * fVar253 +
                        fVar277 * fStack_4a8 + fVar216 * fStack_428 + fStack_268 * fVar239);
    local_900._24_4_ = fVar329;
    local_900._28_4_ = fStack_204;
    fVar217 = fVar176 * ((float)local_220._0_4_ * fVar241 +
                        fVar229 * (float)local_3e0._0_4_ +
                        fVar178 * (float)local_4e0._0_4_ + fVar217 * (float)local_460._0_4_);
    fVar229 = fVar195 * ((float)local_220._4_4_ * fVar242 +
                        fVar230 * (float)local_3e0._4_4_ +
                        fVar175 * (float)local_4e0._4_4_ + fVar313 * (float)local_460._4_4_);
    auVar172._4_4_ = fVar229;
    auVar172._0_4_ = fVar217;
    fVar230 = fVar177 * (fStack_218 * fVar244 +
                        fVar232 * fStack_3d8 + fVar194 * fStack_4d8 + fVar226 * fStack_458);
    auVar172._8_4_ = fVar230;
    fVar272 = fVar272 * (fStack_214 * fVar250 +
                        fVar235 * fStack_3d4 + fVar196 * fStack_4d4 + fVar227 * fStack_454);
    auVar172._12_4_ = fVar272;
    fVar176 = fVar176 * (fStack_210 * fVar251 +
                        fVar236 * fStack_3d0 + fVar256 * fStack_4d0 + fVar214 * fStack_450);
    auVar172._16_4_ = fVar176;
    fVar195 = fVar195 * (fStack_20c * fVar252 +
                        fVar238 * fStack_3cc + fVar267 * fStack_4cc + fVar215 * fStack_44c);
    auVar172._20_4_ = fVar195;
    fVar177 = fVar177 * (fStack_208 * fVar253 +
                        fVar239 * fStack_3c8 + fVar277 * fStack_4c8 + fVar216 * fStack_448);
    auVar172._24_4_ = fVar177;
    auVar172._28_4_ = fVar233;
    auVar58._4_4_ = fVar269;
    auVar58._0_4_ = fVar258;
    auVar58._8_4_ = fVar274;
    auVar58._12_4_ = fVar279;
    auVar58._16_4_ = fVar283;
    auVar58._20_4_ = fVar287;
    auVar58._24_4_ = fVar291;
    auVar58._28_4_ = fVar295;
    auVar89 = vperm2f128_avx(auVar58,auVar58,1);
    auVar89 = vshufps_avx(auVar89,auVar58,0x30);
    auVar10 = vshufps_avx(auVar58,auVar89,0x29);
    auVar63._4_4_ = fStack_83c;
    auVar63._0_4_ = local_840;
    auVar63._8_4_ = fStack_838;
    auVar63._12_4_ = aStack_834;
    auVar63._16_4_ = fStack_830;
    auVar63._20_4_ = fStack_82c;
    auVar63._24_4_ = fStack_828;
    auVar63._28_4_ = fStack_824;
    auVar89 = vperm2f128_avx(auVar63,auVar63,1);
    auVar89 = vshufps_avx(auVar89,auVar63,0x30);
    local_880 = vshufps_avx(auVar63,auVar89,0x29);
    auVar90 = vsubps_avx(_local_ae0,auVar172);
    auVar89 = vperm2f128_avx(auVar90,auVar90,1);
    auVar89 = vshufps_avx(auVar89,auVar90,0x30);
    _local_7a0 = vshufps_avx(auVar90,auVar89,0x29);
    local_700 = vsubps_avx(auVar10,auVar58);
    local_6e0 = vsubps_avx(local_880,auVar63);
    fVar178 = local_700._0_4_;
    fVar196 = local_700._4_4_;
    auVar92._4_4_ = fVar319 * fVar196;
    auVar92._0_4_ = fVar314 * fVar178;
    fVar313 = local_700._8_4_;
    auVar92._8_4_ = fVar321 * fVar313;
    fVar215 = local_700._12_4_;
    auVar92._12_4_ = fVar323 * fVar215;
    fVar238 = local_700._16_4_;
    auVar92._16_4_ = fVar325 * fVar238;
    fVar251 = local_700._20_4_;
    auVar92._20_4_ = fVar327 * fVar251;
    fVar268 = local_700._24_4_;
    auVar92._24_4_ = fVar329 * fVar268;
    auVar92._28_4_ = auVar90._28_4_;
    fVar175 = local_6e0._0_4_;
    fVar256 = local_6e0._4_4_;
    auVar13._4_4_ = fVar307 * fVar256;
    auVar13._0_4_ = fVar301 * fVar175;
    fVar226 = local_6e0._8_4_;
    auVar13._8_4_ = fVar308 * fVar226;
    fVar216 = local_6e0._12_4_;
    auVar13._12_4_ = fVar309 * fVar216;
    fVar239 = local_6e0._16_4_;
    auVar13._16_4_ = fVar310 * fVar239;
    fVar252 = local_6e0._20_4_;
    auVar13._20_4_ = fVar311 * fVar252;
    fVar273 = local_6e0._24_4_;
    auVar13._24_4_ = fVar312 * fVar273;
    auVar13._28_4_ = auVar89._28_4_;
    auVar12 = vsubps_avx(auVar13,auVar92);
    auVar60._4_4_ = fStack_85c;
    auVar60._0_4_ = local_860;
    auVar60._8_4_ = fStack_858;
    auVar60._12_4_ = fStack_854;
    auVar60._16_4_ = fStack_850;
    auVar60._20_4_ = fStack_84c;
    auVar60._24_4_ = fStack_848;
    auVar60._28_4_ = fStack_844;
    auVar89 = vperm2f128_avx(auVar60,auVar60,1);
    auVar89 = vshufps_avx(auVar89,auVar60,0x30);
    local_a00 = vshufps_avx(auVar60,auVar89,0x29);
    local_2c0 = vsubps_avx(local_a00,auVar60);
    auVar14._4_4_ = fVar270 * fVar256;
    auVar14._0_4_ = fVar259 * fVar175;
    auVar14._8_4_ = fVar275 * fVar226;
    auVar14._12_4_ = fVar280 * fVar216;
    auVar14._16_4_ = fVar284 * fVar239;
    auVar14._20_4_ = fVar288 * fVar252;
    auVar14._24_4_ = fVar292 * fVar273;
    auVar14._28_4_ = auVar89._28_4_;
    fVar194 = local_2c0._0_4_;
    fVar267 = local_2c0._4_4_;
    auVar263._4_4_ = fVar319 * fVar267;
    auVar263._0_4_ = fVar314 * fVar194;
    fVar227 = local_2c0._8_4_;
    auVar263._8_4_ = fVar321 * fVar227;
    fVar232 = local_2c0._12_4_;
    auVar263._12_4_ = fVar323 * fVar232;
    fVar241 = local_2c0._16_4_;
    auVar263._16_4_ = fVar325 * fVar241;
    fVar253 = local_2c0._20_4_;
    auVar263._20_4_ = fVar327 * fVar253;
    fVar278 = local_2c0._24_4_;
    auVar263._24_4_ = fVar329 * fVar278;
    auVar263._28_4_ = local_880._28_4_;
    auVar172 = vsubps_avx(auVar263,auVar14);
    auVar11._4_4_ = fVar307 * fVar267;
    auVar11._0_4_ = fVar301 * fVar194;
    auVar11._8_4_ = fVar308 * fVar227;
    auVar11._12_4_ = fVar309 * fVar232;
    auVar11._16_4_ = fVar310 * fVar241;
    auVar11._20_4_ = fVar311 * fVar253;
    auVar11._24_4_ = fVar312 * fVar278;
    auVar11._28_4_ = local_880._28_4_;
    auVar15._4_4_ = fVar270 * fVar196;
    auVar15._0_4_ = fVar259 * fVar178;
    auVar15._8_4_ = fVar275 * fVar313;
    auVar15._12_4_ = fVar280 * fVar215;
    auVar15._16_4_ = fVar284 * fVar238;
    auVar15._20_4_ = fVar288 * fVar251;
    auVar15._24_4_ = fVar292 * fVar268;
    auVar15._28_4_ = fVar300;
    auVar92 = vsubps_avx(auVar15,auVar11);
    fVar155 = auVar92._28_4_;
    fVar277 = auVar172._28_4_ + fVar155;
    auVar171._0_4_ = fVar194 * fVar194 + fVar178 * fVar178 + fVar175 * fVar175;
    auVar171._4_4_ = fVar267 * fVar267 + fVar196 * fVar196 + fVar256 * fVar256;
    auVar171._8_4_ = fVar227 * fVar227 + fVar313 * fVar313 + fVar226 * fVar226;
    auVar171._12_4_ = fVar232 * fVar232 + fVar215 * fVar215 + fVar216 * fVar216;
    auVar171._16_4_ = fVar241 * fVar241 + fVar238 * fVar238 + fVar239 * fVar239;
    auVar171._20_4_ = fVar253 * fVar253 + fVar251 * fVar251 + fVar252 * fVar252;
    auVar171._24_4_ = fVar278 * fVar278 + fVar268 * fVar268 + fVar273 * fVar273;
    auVar171._28_4_ = fVar155 + fVar155 + fVar277;
    auVar89 = vrcpps_avx(auVar171);
    fVar214 = auVar89._0_4_;
    fVar235 = auVar89._4_4_;
    auVar16._4_4_ = fVar235 * auVar171._4_4_;
    auVar16._0_4_ = fVar214 * auVar171._0_4_;
    fVar236 = auVar89._8_4_;
    auVar16._8_4_ = fVar236 * auVar171._8_4_;
    fVar242 = auVar89._12_4_;
    auVar16._12_4_ = fVar242 * auVar171._12_4_;
    fVar244 = auVar89._16_4_;
    auVar16._16_4_ = fVar244 * auVar171._16_4_;
    fVar250 = auVar89._20_4_;
    auVar16._20_4_ = fVar250 * auVar171._20_4_;
    fVar254 = auVar89._24_4_;
    auVar16._24_4_ = fVar254 * auVar171._24_4_;
    auVar16._28_4_ = fVar300;
    auVar334._8_4_ = 0x3f800000;
    auVar334._0_8_ = 0x3f8000003f800000;
    auVar334._12_4_ = 0x3f800000;
    auVar334._16_4_ = 0x3f800000;
    auVar334._20_4_ = 0x3f800000;
    auVar334._24_4_ = 0x3f800000;
    auVar334._28_4_ = 0x3f800000;
    auVar13 = vsubps_avx(auVar334,auVar16);
    fVar214 = auVar13._0_4_ * fVar214 + fVar214;
    fVar235 = auVar13._4_4_ * fVar235 + fVar235;
    fVar236 = auVar13._8_4_ * fVar236 + fVar236;
    fVar242 = auVar13._12_4_ * fVar242 + fVar242;
    fVar244 = auVar13._16_4_ * fVar244 + fVar244;
    fVar250 = auVar13._20_4_ * fVar250 + fVar250;
    fVar254 = auVar13._24_4_ * fVar254 + fVar254;
    auVar90 = vperm2f128_avx(local_980,local_980,1);
    auVar90 = vshufps_avx(auVar90,local_980,0x30);
    local_a20 = vshufps_avx(local_980,auVar90,0x29);
    auVar90 = vperm2f128_avx(local_900,local_900,1);
    auVar90 = vshufps_avx(auVar90,local_900,0x30);
    local_740 = vshufps_avx(local_900,auVar90,0x29);
    fVar315 = local_740._0_4_;
    fVar320 = local_740._4_4_;
    auVar17._4_4_ = fVar320 * fVar196;
    auVar17._0_4_ = fVar315 * fVar178;
    fVar322 = local_740._8_4_;
    auVar17._8_4_ = fVar322 * fVar313;
    fVar324 = local_740._12_4_;
    auVar17._12_4_ = fVar324 * fVar215;
    fVar326 = local_740._16_4_;
    auVar17._16_4_ = fVar326 * fVar238;
    fVar328 = local_740._20_4_;
    auVar17._20_4_ = fVar328 * fVar251;
    fVar330 = local_740._24_4_;
    auVar17._24_4_ = fVar330 * fVar268;
    auVar17._28_4_ = auVar90._28_4_;
    fVar332 = local_a20._0_4_;
    fVar337 = local_a20._4_4_;
    auVar18._4_4_ = fVar337 * fVar256;
    auVar18._0_4_ = fVar332 * fVar175;
    fVar338 = local_a20._8_4_;
    auVar18._8_4_ = fVar338 * fVar226;
    fVar339 = local_a20._12_4_;
    auVar18._12_4_ = fVar339 * fVar216;
    fVar340 = local_a20._16_4_;
    auVar18._16_4_ = fVar340 * fVar239;
    fVar341 = local_a20._20_4_;
    auVar18._20_4_ = fVar341 * fVar252;
    fVar342 = local_a20._24_4_;
    auVar18._24_4_ = fVar342 * fVar273;
    auVar18._28_4_ = uStack_1e4;
    auVar14 = vsubps_avx(auVar18,auVar17);
    auVar90 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar90 = vshufps_avx(auVar90,local_9e0,0x30);
    local_920 = vshufps_avx(local_9e0,auVar90,0x29);
    fVar260 = local_920._0_4_;
    fVar271 = local_920._4_4_;
    auVar19._4_4_ = fVar271 * fVar256;
    auVar19._0_4_ = fVar260 * fVar175;
    fVar276 = local_920._8_4_;
    auVar19._8_4_ = fVar276 * fVar226;
    fVar281 = local_920._12_4_;
    auVar19._12_4_ = fVar281 * fVar216;
    fVar285 = local_920._16_4_;
    auVar19._16_4_ = fVar285 * fVar239;
    fVar289 = local_920._20_4_;
    auVar19._20_4_ = fVar289 * fVar252;
    fVar293 = local_920._24_4_;
    auVar19._24_4_ = fVar293 * fVar273;
    auVar19._28_4_ = auVar90._28_4_;
    auVar20._4_4_ = fVar320 * fVar267;
    auVar20._0_4_ = fVar315 * fVar194;
    auVar20._8_4_ = fVar322 * fVar227;
    auVar20._12_4_ = fVar324 * fVar232;
    auVar20._16_4_ = fVar326 * fVar241;
    auVar20._20_4_ = fVar328 * fVar253;
    uVar74 = local_740._28_4_;
    auVar20._24_4_ = fVar330 * fVar278;
    auVar20._28_4_ = uVar74;
    auVar90 = vsubps_avx(auVar20,auVar19);
    auVar21._4_4_ = fVar337 * fVar267;
    auVar21._0_4_ = fVar332 * fVar194;
    auVar21._8_4_ = fVar338 * fVar227;
    auVar21._12_4_ = fVar339 * fVar232;
    auVar21._16_4_ = fVar340 * fVar241;
    auVar21._20_4_ = fVar341 * fVar253;
    auVar21._24_4_ = fVar342 * fVar278;
    auVar21._28_4_ = uVar74;
    auVar22._4_4_ = fVar271 * fVar196;
    auVar22._0_4_ = fVar260 * fVar178;
    auVar22._8_4_ = fVar276 * fVar313;
    auVar22._12_4_ = fVar281 * fVar215;
    auVar22._16_4_ = fVar285 * fVar238;
    auVar22._20_4_ = fVar289 * fVar251;
    auVar22._24_4_ = fVar293 * fVar268;
    auVar22._28_4_ = local_a20._28_4_;
    auVar263 = vsubps_avx(auVar22,auVar21);
    fVar155 = auVar263._28_4_;
    fVar257 = auVar90._28_4_ + fVar155;
    auVar23._4_4_ =
         (auVar12._4_4_ * auVar12._4_4_ +
         auVar172._4_4_ * auVar172._4_4_ + auVar92._4_4_ * auVar92._4_4_) * fVar235;
    auVar23._0_4_ =
         (auVar12._0_4_ * auVar12._0_4_ +
         auVar172._0_4_ * auVar172._0_4_ + auVar92._0_4_ * auVar92._0_4_) * fVar214;
    auVar23._8_4_ =
         (auVar12._8_4_ * auVar12._8_4_ +
         auVar172._8_4_ * auVar172._8_4_ + auVar92._8_4_ * auVar92._8_4_) * fVar236;
    auVar23._12_4_ =
         (auVar12._12_4_ * auVar12._12_4_ +
         auVar172._12_4_ * auVar172._12_4_ + auVar92._12_4_ * auVar92._12_4_) * fVar242;
    auVar23._16_4_ =
         (auVar12._16_4_ * auVar12._16_4_ +
         auVar172._16_4_ * auVar172._16_4_ + auVar92._16_4_ * auVar92._16_4_) * fVar244;
    auVar23._20_4_ =
         (auVar12._20_4_ * auVar12._20_4_ +
         auVar172._20_4_ * auVar172._20_4_ + auVar92._20_4_ * auVar92._20_4_) * fVar250;
    auVar23._24_4_ =
         (auVar12._24_4_ * auVar12._24_4_ +
         auVar172._24_4_ * auVar172._24_4_ + auVar92._24_4_ * auVar92._24_4_) * fVar254;
    auVar23._28_4_ = auVar12._28_4_ + fVar277;
    auVar24._4_4_ =
         (auVar14._4_4_ * auVar14._4_4_ +
         auVar90._4_4_ * auVar90._4_4_ + auVar263._4_4_ * auVar263._4_4_) * fVar235;
    auVar24._0_4_ =
         (auVar14._0_4_ * auVar14._0_4_ +
         auVar90._0_4_ * auVar90._0_4_ + auVar263._0_4_ * auVar263._0_4_) * fVar214;
    auVar24._8_4_ =
         (auVar14._8_4_ * auVar14._8_4_ +
         auVar90._8_4_ * auVar90._8_4_ + auVar263._8_4_ * auVar263._8_4_) * fVar236;
    auVar24._12_4_ =
         (auVar14._12_4_ * auVar14._12_4_ +
         auVar90._12_4_ * auVar90._12_4_ + auVar263._12_4_ * auVar263._12_4_) * fVar242;
    auVar24._16_4_ =
         (auVar14._16_4_ * auVar14._16_4_ +
         auVar90._16_4_ * auVar90._16_4_ + auVar263._16_4_ * auVar263._16_4_) * fVar244;
    auVar24._20_4_ =
         (auVar14._20_4_ * auVar14._20_4_ +
         auVar90._20_4_ * auVar90._20_4_ + auVar263._20_4_ * auVar263._20_4_) * fVar250;
    auVar24._24_4_ =
         (auVar14._24_4_ * auVar14._24_4_ +
         auVar90._24_4_ * auVar90._24_4_ + auVar263._24_4_ * auVar263._24_4_) * fVar254;
    auVar24._28_4_ = auVar13._28_4_ + auVar89._28_4_;
    _local_a40 = vmaxps_avx(auVar23,auVar24);
    auVar89 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar89 = vshufps_avx(auVar89,_local_ae0,0x30);
    _local_7c0 = vshufps_avx(_local_ae0,auVar89,0x29);
    local_8e0._0_4_ = (float)local_ae0._0_4_ + fVar217;
    local_8e0._4_4_ = (float)local_ae0._4_4_ + fVar229;
    local_8e0._8_4_ = fStack_ad8 + fVar230;
    local_8e0._12_4_ = fStack_ad4 + fVar272;
    local_8e0._16_4_ = fStack_ad0 + fVar176;
    local_8e0._20_4_ = fStack_acc + fVar195;
    local_8e0._24_4_ = fStack_ac8 + fVar177;
    local_8e0._28_4_ = fStack_ac4 + fVar233;
    auVar89 = vmaxps_avx(_local_ae0,local_8e0);
    auVar90 = vmaxps_avx(_local_7a0,_local_7c0);
    auVar89 = vmaxps_avx(auVar89,auVar90);
    auVar90 = vrsqrtps_avx(auVar171);
    fVar176 = auVar90._0_4_;
    fVar195 = auVar90._4_4_;
    fVar177 = auVar90._8_4_;
    fVar272 = auVar90._12_4_;
    fVar277 = auVar90._16_4_;
    fVar217 = auVar90._20_4_;
    fVar229 = auVar90._24_4_;
    auVar25._4_4_ = fVar195 * fVar195 * fVar195 * auVar171._4_4_ * 0.5;
    auVar25._0_4_ = fVar176 * fVar176 * fVar176 * auVar171._0_4_ * 0.5;
    auVar25._8_4_ = fVar177 * fVar177 * fVar177 * auVar171._8_4_ * 0.5;
    auVar25._12_4_ = fVar272 * fVar272 * fVar272 * auVar171._12_4_ * 0.5;
    auVar25._16_4_ = fVar277 * fVar277 * fVar277 * auVar171._16_4_ * 0.5;
    auVar25._20_4_ = fVar217 * fVar217 * fVar217 * auVar171._20_4_ * 0.5;
    auVar25._24_4_ = fVar229 * fVar229 * fVar229 * auVar171._24_4_ * 0.5;
    auVar25._28_4_ = auVar171._28_4_;
    auVar26._4_4_ = fVar195 * 1.5;
    auVar26._0_4_ = fVar176 * 1.5;
    auVar26._8_4_ = fVar177 * 1.5;
    auVar26._12_4_ = fVar272 * 1.5;
    auVar26._16_4_ = fVar277 * 1.5;
    auVar26._20_4_ = fVar217 * 1.5;
    auVar26._24_4_ = fVar229 * 1.5;
    auVar26._28_4_ = auVar90._28_4_;
    local_520 = vsubps_avx(auVar26,auVar25);
    auVar59._4_4_ = fVar269;
    auVar59._0_4_ = fVar258;
    auVar59._8_4_ = fVar274;
    auVar59._12_4_ = fVar279;
    auVar59._16_4_ = fVar283;
    auVar59._20_4_ = fVar287;
    auVar59._24_4_ = fVar291;
    auVar59._28_4_ = fVar295;
    auVar12 = vsubps_avx(ZEXT832(0) << 0x20,auVar59);
    auVar172 = vsubps_avx(ZEXT832(0) << 0x20,auVar63);
    fVar347 = auVar172._0_4_;
    fVar349 = auVar172._4_4_;
    fVar350 = auVar172._8_4_;
    fVar351 = auVar172._12_4_;
    fVar352 = auVar172._16_4_;
    fVar353 = auVar172._20_4_;
    fVar354 = auVar172._24_4_;
    fVar176 = auVar12._0_4_;
    fVar272 = auVar12._4_4_;
    fVar229 = auVar12._8_4_;
    fVar233 = auVar12._12_4_;
    fVar242 = auVar12._16_4_;
    fVar254 = auVar12._20_4_;
    fVar282 = auVar12._24_4_;
    auVar263 = ZEXT832(0) << 0x20;
    auVar172 = vsubps_avx(auVar263,auVar60);
    fVar195 = auVar172._0_4_;
    fVar277 = auVar172._4_4_;
    fVar230 = auVar172._8_4_;
    fVar235 = auVar172._12_4_;
    fVar244 = auVar172._16_4_;
    fVar255 = auVar172._20_4_;
    fVar286 = auVar172._24_4_;
    auVar297._0_4_ = local_620 * fVar195 + local_640 * fVar176 + fVar347 * local_660;
    auVar297._4_4_ = fStack_61c * fVar277 + fStack_63c * fVar272 + fVar349 * fStack_65c;
    auVar297._8_4_ = fStack_618 * fVar230 + fStack_638 * fVar229 + fVar350 * fStack_658;
    auVar297._12_4_ = fStack_614 * fVar235 + fStack_634 * fVar233 + fVar351 * fStack_654;
    auVar297._16_4_ = fStack_610 * fVar244 + fStack_630 * fVar242 + fVar352 * fStack_650;
    auVar297._20_4_ = fStack_60c * fVar255 + fStack_62c * fVar254 + fVar353 * fStack_64c;
    auVar297._24_4_ = fStack_608 * fVar286 + fStack_628 * fVar282 + fVar354 * fStack_648;
    auVar297._28_4_ = fVar257 + auVar14._28_4_ + fVar257 + auVar90._28_4_;
    auVar302._0_4_ = fVar195 * fVar195 + fVar176 * fVar176 + fVar347 * fVar347;
    auVar302._4_4_ = fVar277 * fVar277 + fVar272 * fVar272 + fVar349 * fVar349;
    auVar302._8_4_ = fVar230 * fVar230 + fVar229 * fVar229 + fVar350 * fVar350;
    auVar302._12_4_ = fVar235 * fVar235 + fVar233 * fVar233 + fVar351 * fVar351;
    auVar302._16_4_ = fVar244 * fVar244 + fVar242 * fVar242 + fVar352 * fVar352;
    auVar302._20_4_ = fVar255 * fVar255 + fVar254 * fVar254 + fVar353 * fVar353;
    auVar302._24_4_ = fVar286 * fVar286 + fVar282 * fVar282 + fVar354 * fVar354;
    auVar302._28_4_ = fVar155 + fVar155 + fVar257;
    fVar177 = local_520._0_4_;
    fVar217 = local_520._4_4_;
    fVar214 = local_520._8_4_;
    fVar236 = local_520._12_4_;
    fVar250 = local_520._16_4_;
    fVar257 = local_520._20_4_;
    fVar290 = local_520._24_4_;
    fVar294 = local_6e0._28_4_;
    local_540 = local_620 * fVar177 * fVar194 +
                fVar178 * fVar177 * local_640 + fVar177 * fVar175 * local_660;
    fStack_53c = fStack_61c * fVar217 * fVar267 +
                 fVar196 * fVar217 * fStack_63c + fVar217 * fVar256 * fStack_65c;
    fStack_538 = fStack_618 * fVar214 * fVar227 +
                 fVar313 * fVar214 * fStack_638 + fVar214 * fVar226 * fStack_658;
    fStack_534 = fStack_614 * fVar236 * fVar232 +
                 fVar215 * fVar236 * fStack_634 + fVar236 * fVar216 * fStack_654;
    fStack_530 = fStack_610 * fVar250 * fVar241 +
                 fVar238 * fVar250 * fStack_630 + fVar250 * fVar239 * fStack_650;
    fStack_52c = fStack_60c * fVar257 * fVar253 +
                 fVar251 * fVar257 * fStack_62c + fVar257 * fVar252 * fStack_64c;
    fStack_528 = fStack_608 * fVar290 * fVar278 +
                 fVar268 * fVar290 * fStack_628 + fVar290 * fVar273 * fStack_648;
    fVar155 = fStack_604 + fVar294 + fStack_644;
    local_560._0_4_ =
         fVar195 * fVar177 * fVar194 + fVar178 * fVar177 * fVar176 + fVar347 * fVar177 * fVar175;
    local_560._4_4_ =
         fVar277 * fVar217 * fVar267 + fVar196 * fVar217 * fVar272 + fVar349 * fVar217 * fVar256;
    local_560._8_4_ =
         fVar230 * fVar214 * fVar227 + fVar313 * fVar214 * fVar229 + fVar350 * fVar214 * fVar226;
    local_560._12_4_ =
         fVar235 * fVar236 * fVar232 + fVar215 * fVar236 * fVar233 + fVar351 * fVar236 * fVar216;
    local_560._16_4_ =
         fVar244 * fVar250 * fVar241 + fVar238 * fVar250 * fVar242 + fVar352 * fVar250 * fVar239;
    local_560._20_4_ =
         fVar255 * fVar257 * fVar253 + fVar251 * fVar257 * fVar254 + fVar353 * fVar257 * fVar252;
    local_560._24_4_ =
         fVar286 * fVar290 * fVar278 + fVar268 * fVar290 * fVar282 + fVar354 * fVar290 * fVar273;
    local_560._28_4_ = fVar294 + fVar155;
    auVar27._4_4_ = fStack_53c * local_560._4_4_;
    auVar27._0_4_ = local_540 * local_560._0_4_;
    auVar27._8_4_ = fStack_538 * local_560._8_4_;
    auVar27._12_4_ = fStack_534 * local_560._12_4_;
    auVar27._16_4_ = fStack_530 * local_560._16_4_;
    auVar27._20_4_ = fStack_52c * local_560._20_4_;
    auVar27._24_4_ = fStack_528 * local_560._24_4_;
    auVar27._28_4_ = fVar155;
    auVar90 = vsubps_avx(auVar297,auVar27);
    auVar28._4_4_ = local_560._4_4_ * local_560._4_4_;
    auVar28._0_4_ = local_560._0_4_ * local_560._0_4_;
    auVar28._8_4_ = local_560._8_4_ * local_560._8_4_;
    auVar28._12_4_ = local_560._12_4_ * local_560._12_4_;
    auVar28._16_4_ = local_560._16_4_ * local_560._16_4_;
    auVar28._20_4_ = local_560._20_4_ * local_560._20_4_;
    auVar28._24_4_ = local_560._24_4_ * local_560._24_4_;
    auVar28._28_4_ = fVar294;
    local_680 = vsubps_avx(auVar302,auVar28);
    local_6c0 = vsqrtps_avx(_local_a40);
    fVar155 = (local_6c0._0_4_ + auVar89._0_4_) * 1.0000002;
    fVar299 = (local_6c0._4_4_ + auVar89._4_4_) * 1.0000002;
    fVar331 = (local_6c0._8_4_ + auVar89._8_4_) * 1.0000002;
    fVar100 = (local_6c0._12_4_ + auVar89._12_4_) * 1.0000002;
    fVar101 = (local_6c0._16_4_ + auVar89._16_4_) * 1.0000002;
    fVar102 = (local_6c0._20_4_ + auVar89._20_4_) * 1.0000002;
    fVar103 = (local_6c0._24_4_ + auVar89._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar299 * fVar299;
    auVar29._0_4_ = fVar155 * fVar155;
    auVar29._8_4_ = fVar331 * fVar331;
    auVar29._12_4_ = fVar100 * fVar100;
    auVar29._16_4_ = fVar101 * fVar101;
    auVar29._20_4_ = fVar102 * fVar102;
    auVar29._24_4_ = fVar103 * fVar103;
    auVar29._28_4_ = local_6c0._28_4_ + auVar89._28_4_;
    local_8a0._0_4_ = auVar90._0_4_ + auVar90._0_4_;
    local_8a0._4_4_ = auVar90._4_4_ + auVar90._4_4_;
    local_8a0._8_4_ = auVar90._8_4_ + auVar90._8_4_;
    local_8a0._12_4_ = auVar90._12_4_ + auVar90._12_4_;
    local_8a0._16_4_ = auVar90._16_4_ + auVar90._16_4_;
    local_8a0._20_4_ = auVar90._20_4_ + auVar90._20_4_;
    local_8a0._24_4_ = auVar90._24_4_ + auVar90._24_4_;
    fVar155 = auVar90._28_4_;
    local_8a0._28_4_ = fVar155 + fVar155;
    auVar90 = vsubps_avx(local_680,auVar29);
    auVar318 = ZEXT3264(auVar90);
    auVar30._4_4_ = fStack_53c * fStack_53c;
    auVar30._0_4_ = local_540 * local_540;
    auVar30._8_4_ = fStack_538 * fStack_538;
    auVar30._12_4_ = fStack_534 * fStack_534;
    auVar30._16_4_ = fStack_530 * fStack_530;
    auVar30._20_4_ = fStack_52c * fStack_52c;
    auVar30._24_4_ = fStack_528 * fStack_528;
    auVar30._28_4_ = fVar155;
    auVar306 = ZEXT3264(local_2a0);
    auVar92 = vsubps_avx(local_2a0,auVar30);
    local_6a0._4_4_ = local_8a0._4_4_ * local_8a0._4_4_;
    local_6a0._0_4_ = (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
    local_6a0._8_4_ = local_8a0._8_4_ * local_8a0._8_4_;
    local_6a0._12_4_ = local_8a0._12_4_ * local_8a0._12_4_;
    local_6a0._16_4_ = local_8a0._16_4_ * local_8a0._16_4_;
    local_6a0._20_4_ = local_8a0._20_4_ * local_8a0._20_4_;
    local_6a0._24_4_ = local_8a0._24_4_ * local_8a0._24_4_;
    local_6a0._28_4_ = local_680._28_4_;
    fVar155 = auVar92._0_4_;
    local_7e0._0_4_ = fVar155 * 4.0;
    fVar299 = auVar92._4_4_;
    local_7e0._4_4_ = fVar299 * 4.0;
    fVar331 = auVar92._8_4_;
    fStack_7d8 = fVar331 * 4.0;
    fVar100 = auVar92._12_4_;
    fStack_7d4 = fVar100 * 4.0;
    fVar101 = auVar92._16_4_;
    fStack_7d0 = fVar101 * 4.0;
    fVar102 = auVar92._20_4_;
    fStack_7cc = fVar102 * 4.0;
    fVar103 = auVar92._24_4_;
    fStack_7c8 = fVar103 * 4.0;
    uStack_7c4 = 0x40800000;
    auVar31._4_4_ = auVar90._4_4_ * (float)local_7e0._4_4_;
    auVar31._0_4_ = auVar90._0_4_ * (float)local_7e0._0_4_;
    auVar31._8_4_ = auVar90._8_4_ * fStack_7d8;
    auVar31._12_4_ = auVar90._12_4_ * fStack_7d4;
    auVar31._16_4_ = auVar90._16_4_ * fStack_7d0;
    auVar31._20_4_ = auVar90._20_4_ * fStack_7cc;
    auVar31._24_4_ = auVar90._24_4_ * fStack_7c8;
    auVar31._28_4_ = 0x40800000;
    auVar13 = vsubps_avx(local_6a0,auVar31);
    auVar89 = vcmpps_avx(auVar13,auVar263,5);
    auVar118._8_4_ = 0x7fffffff;
    auVar118._0_8_ = 0x7fffffff7fffffff;
    auVar118._12_4_ = 0x7fffffff;
    auVar118._16_4_ = 0x7fffffff;
    auVar118._20_4_ = 0x7fffffff;
    auVar118._24_4_ = 0x7fffffff;
    auVar118._28_4_ = 0x7fffffff;
    local_3a0 = vandps_avx(auVar30,auVar118);
    local_300._0_4_ = fVar155 + fVar155;
    local_300._4_4_ = fVar299 + fVar299;
    local_300._8_4_ = fVar331 + fVar331;
    local_300._12_4_ = fVar100 + fVar100;
    local_300._16_4_ = fVar101 + fVar101;
    local_300._20_4_ = fVar102 + fVar102;
    local_300._24_4_ = fVar103 + fVar103;
    local_300._28_4_ = auVar92._28_4_ + auVar92._28_4_;
    _local_a40 = vandps_avx(auVar92,auVar118);
    uVar71 = CONCAT44(local_8a0._4_4_,local_8a0._0_4_);
    local_2e0._0_8_ = uVar71 ^ 0x8000000080000000;
    local_2e0._8_4_ = -local_8a0._8_4_;
    local_2e0._12_4_ = -local_8a0._12_4_;
    local_2e0._16_4_ = -local_8a0._16_4_;
    local_2e0._20_4_ = -local_8a0._20_4_;
    local_2e0._24_4_ = -local_8a0._24_4_;
    local_2e0._28_4_ = -local_8a0._28_4_;
    if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar89 >> 0x7f,0) == '\0') &&
          (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar89 >> 0xbf,0) == '\0') &&
        (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar89[0x1f]) {
      auVar298 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar91._8_4_ = 0xff800000;
      auVar91._0_8_ = 0xff800000ff800000;
      auVar91._12_4_ = 0xff800000;
      auVar91._16_4_ = 0xff800000;
      auVar91._20_4_ = 0xff800000;
      auVar91._24_4_ = 0xff800000;
      auVar91._28_4_ = 0xff800000;
    }
    else {
      local_8c0 = auVar89;
      auVar11 = vsqrtps_avx(auVar13);
      auVar92 = vrcpps_avx(local_300);
      auVar14 = vcmpps_avx(auVar13,auVar263,5);
      fVar155 = auVar92._0_4_;
      fVar299 = auVar92._4_4_;
      auVar32._4_4_ = local_300._4_4_ * fVar299;
      auVar32._0_4_ = local_300._0_4_ * fVar155;
      fVar331 = auVar92._8_4_;
      auVar32._8_4_ = local_300._8_4_ * fVar331;
      fVar100 = auVar92._12_4_;
      auVar32._12_4_ = local_300._12_4_ * fVar100;
      fVar101 = auVar92._16_4_;
      auVar32._16_4_ = local_300._16_4_ * fVar101;
      fVar102 = auVar92._20_4_;
      auVar32._20_4_ = local_300._20_4_ * fVar102;
      fVar103 = auVar92._24_4_;
      auVar32._24_4_ = local_300._24_4_ * fVar103;
      auVar32._28_4_ = auVar13._28_4_;
      auVar119._8_4_ = 0x3f800000;
      auVar119._0_8_ = 0x3f8000003f800000;
      auVar119._12_4_ = 0x3f800000;
      auVar119._16_4_ = 0x3f800000;
      auVar119._20_4_ = 0x3f800000;
      auVar119._24_4_ = 0x3f800000;
      auVar119._28_4_ = 0x3f800000;
      auVar13 = vsubps_avx(auVar119,auVar32);
      fVar155 = fVar155 + fVar155 * auVar13._0_4_;
      fVar299 = fVar299 + fVar299 * auVar13._4_4_;
      fVar331 = fVar331 + fVar331 * auVar13._8_4_;
      fVar100 = fVar100 + fVar100 * auVar13._12_4_;
      fVar101 = fVar101 + fVar101 * auVar13._16_4_;
      fVar102 = fVar102 + fVar102 * auVar13._20_4_;
      fVar103 = fVar103 + fVar103 * auVar13._24_4_;
      auVar263 = vsubps_avx(local_2e0,auVar11);
      fVar218 = auVar263._0_4_ * fVar155;
      fVar228 = auVar263._4_4_ * fVar299;
      auVar33._4_4_ = fVar228;
      auVar33._0_4_ = fVar218;
      fVar231 = auVar263._8_4_ * fVar331;
      auVar33._8_4_ = fVar231;
      fVar234 = auVar263._12_4_ * fVar100;
      auVar33._12_4_ = fVar234;
      fVar237 = auVar263._16_4_ * fVar101;
      auVar33._16_4_ = fVar237;
      fVar240 = auVar263._20_4_ * fVar102;
      auVar33._20_4_ = fVar240;
      fVar243 = auVar263._24_4_ * fVar103;
      auVar33._24_4_ = fVar243;
      auVar33._28_4_ = auVar263._28_4_;
      auVar263 = vsubps_avx(auVar11,local_8a0);
      fVar155 = auVar263._0_4_ * fVar155;
      fVar299 = auVar263._4_4_ * fVar299;
      auVar34._4_4_ = fVar299;
      auVar34._0_4_ = fVar155;
      fVar331 = auVar263._8_4_ * fVar331;
      auVar34._8_4_ = fVar331;
      fVar100 = auVar263._12_4_ * fVar100;
      auVar34._12_4_ = fVar100;
      fVar101 = auVar263._16_4_ * fVar101;
      auVar34._16_4_ = fVar101;
      fVar102 = auVar263._20_4_ * fVar102;
      auVar34._20_4_ = fVar102;
      fVar103 = auVar263._24_4_ * fVar103;
      auVar34._24_4_ = fVar103;
      auVar34._28_4_ = auVar92._28_4_ + auVar13._28_4_;
      local_380 = fVar177 * (local_560._0_4_ + local_540 * fVar218);
      fStack_37c = fVar217 * (local_560._4_4_ + fStack_53c * fVar228);
      fStack_378 = fVar214 * (local_560._8_4_ + fStack_538 * fVar231);
      fStack_374 = fVar236 * (local_560._12_4_ + fStack_534 * fVar234);
      fStack_370 = fVar250 * (local_560._16_4_ + fStack_530 * fVar237);
      fStack_36c = fVar257 * (local_560._20_4_ + fStack_52c * fVar240);
      fStack_368 = fVar290 * (local_560._24_4_ + fStack_528 * fVar243);
      uStack_364 = 0x3f800000;
      local_360 = fVar177 * (local_560._0_4_ + local_540 * fVar155);
      fStack_35c = fVar217 * (local_560._4_4_ + fStack_53c * fVar299);
      fStack_358 = fVar214 * (local_560._8_4_ + fStack_538 * fVar331);
      fStack_354 = fVar236 * (local_560._12_4_ + fStack_534 * fVar100);
      fStack_350 = fVar250 * (local_560._16_4_ + fStack_530 * fVar101);
      fStack_34c = fVar257 * (local_560._20_4_ + fStack_52c * fVar102);
      fStack_348 = fVar290 * (local_560._24_4_ + fStack_528 * fVar103);
      fStack_344 = local_560._28_4_ + local_560._28_4_ + auVar263._28_4_;
      auVar204._8_4_ = 0x7f800000;
      auVar204._0_8_ = 0x7f8000007f800000;
      auVar204._12_4_ = 0x7f800000;
      auVar204._16_4_ = 0x7f800000;
      auVar204._20_4_ = 0x7f800000;
      auVar204._24_4_ = 0x7f800000;
      auVar204._28_4_ = 0x7f800000;
      auVar92 = vblendvps_avx(auVar204,auVar33,auVar14);
      auVar298 = ZEXT3264(auVar92);
      auVar205._8_4_ = 0xff800000;
      auVar205._0_8_ = 0xff800000ff800000;
      auVar205._12_4_ = 0xff800000;
      auVar205._16_4_ = 0xff800000;
      auVar205._20_4_ = 0xff800000;
      auVar205._24_4_ = 0xff800000;
      auVar205._28_4_ = 0xff800000;
      auVar91 = vblendvps_avx(auVar205,auVar34,auVar14);
      auVar13 = vmaxps_avx(local_500,local_3a0);
      auVar35._4_4_ = auVar13._4_4_ * 1.9073486e-06;
      auVar35._0_4_ = auVar13._0_4_ * 1.9073486e-06;
      auVar35._8_4_ = auVar13._8_4_ * 1.9073486e-06;
      auVar35._12_4_ = auVar13._12_4_ * 1.9073486e-06;
      auVar35._16_4_ = auVar13._16_4_ * 1.9073486e-06;
      auVar35._20_4_ = auVar13._20_4_ * 1.9073486e-06;
      auVar35._24_4_ = auVar13._24_4_ * 1.9073486e-06;
      auVar35._28_4_ = auVar13._28_4_;
      auVar13 = vcmpps_avx(_local_a40,auVar35,1);
      auVar306 = ZEXT3264(auVar13);
      auVar263 = auVar14 & auVar13;
      if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar263 >> 0x7f,0) != '\0') ||
            (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar263 >> 0xbf,0) != '\0') ||
          (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar263[0x1f] < '\0') {
        auVar89 = vandps_avx(auVar13,auVar14);
        auVar162 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
        auVar13 = vcmpps_avx(auVar90,_DAT_01f7b000,2);
        auVar305._8_4_ = 0xff800000;
        auVar305._0_8_ = 0xff800000ff800000;
        auVar305._12_4_ = 0xff800000;
        auVar305._16_4_ = 0xff800000;
        auVar305._20_4_ = 0xff800000;
        auVar305._24_4_ = 0xff800000;
        auVar305._28_4_ = 0xff800000;
        auVar317._8_4_ = 0x7f800000;
        auVar317._0_8_ = 0x7f8000007f800000;
        auVar317._12_4_ = 0x7f800000;
        auVar317._16_4_ = 0x7f800000;
        auVar317._20_4_ = 0x7f800000;
        auVar317._24_4_ = 0x7f800000;
        auVar317._28_4_ = 0x7f800000;
        auVar318 = ZEXT3264(auVar317);
        auVar90 = vblendvps_avx(auVar317,auVar305,auVar13);
        auVar8 = vpmovsxwd_avx(auVar162);
        auVar306 = ZEXT1664(auVar8);
        auVar162 = vpunpckhwd_avx(auVar162,auVar162);
        auVar212._16_16_ = auVar162;
        auVar212._0_16_ = auVar8;
        auVar90 = vblendvps_avx(auVar92,auVar90,auVar212);
        auVar298 = ZEXT3264(auVar90);
        auVar248._8_4_ = 0xff800000;
        auVar248._0_8_ = 0xff800000ff800000;
        auVar248._12_4_ = 0xff800000;
        auVar248._16_4_ = 0xff800000;
        auVar248._20_4_ = 0xff800000;
        auVar248._24_4_ = 0xff800000;
        auVar248._28_4_ = 0xff800000;
        auVar90 = vblendvps_avx(auVar248,auVar317,auVar13);
        auVar91 = vblendvps_avx(auVar91,auVar90,auVar212);
        auVar150._0_8_ = auVar89._0_8_ ^ 0xffffffffffffffff;
        auVar150._8_4_ = auVar89._8_4_ ^ 0xffffffff;
        auVar150._12_4_ = auVar89._12_4_ ^ 0xffffffff;
        auVar150._16_4_ = auVar89._16_4_ ^ 0xffffffff;
        auVar150._20_4_ = auVar89._20_4_ ^ 0xffffffff;
        auVar150._24_4_ = auVar89._24_4_ ^ 0xffffffff;
        auVar150._28_4_ = auVar89._28_4_ ^ 0xffffffff;
        auVar89 = vorps_avx(auVar13,auVar150);
        auVar89 = vandps_avx(auVar14,auVar89);
      }
    }
    auVar249 = ZEXT3264(local_320);
    auVar90 = local_320 & auVar89;
    auVar335 = local_560;
    if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar90 >> 0x7f,0) == '\0') &&
          (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar90 >> 0xbf,0) == '\0') &&
        (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar90[0x1f]) {
LAB_007a9109:
      auVar336 = ZEXT3264(auVar335);
    }
    else {
      fStack_524 = fStack_604 + fVar294 + fStack_644;
      auVar162 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_820._0_4_));
      auVar162 = vshufps_avx(auVar162,auVar162,0);
      auVar206._16_16_ = auVar162;
      auVar206._0_16_ = auVar162;
      local_8c0 = vmaxps_avx(auVar206,auVar298._0_32_);
      auVar162 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_820._0_4_));
      auVar162 = vshufps_avx(auVar162,auVar162,0);
      auVar207._16_16_ = auVar162;
      auVar207._0_16_ = auVar162;
      local_340 = vminps_avx(auVar207,auVar91);
      fVar103 = auVar172._28_4_;
      auVar306 = ZEXT3264(CONCAT428(fStack_644,
                                    CONCAT424(fStack_648,
                                              CONCAT420(fStack_64c,
                                                        CONCAT416(fStack_650,
                                                                  CONCAT412(fStack_654,
                                                                            CONCAT48(fStack_658,
                                                                                     CONCAT44(
                                                  fStack_65c,local_660))))))));
      auVar298 = ZEXT3264(CONCAT428(fStack_624,
                                    CONCAT424(fStack_628,
                                              CONCAT420(fStack_62c,
                                                        CONCAT416(fStack_630,
                                                                  CONCAT412(fStack_634,
                                                                            CONCAT48(fStack_638,
                                                                                     CONCAT44(
                                                  fStack_63c,local_640))))))));
      auVar120._0_4_ = local_620 * fVar259 + local_640 * fVar301 + local_660 * fVar314;
      auVar120._4_4_ = fStack_61c * fVar270 + fStack_63c * fVar307 + fStack_65c * fVar319;
      auVar120._8_4_ = fStack_618 * fVar275 + fStack_638 * fVar308 + fStack_658 * fVar321;
      auVar120._12_4_ = fStack_614 * fVar280 + fStack_634 * fVar309 + fStack_654 * fVar323;
      auVar120._16_4_ = fStack_610 * fVar284 + fStack_630 * fVar310 + fStack_650 * fVar325;
      auVar120._20_4_ = fStack_60c * fVar288 + fStack_62c * fVar311 + fStack_64c * fVar327;
      auVar120._24_4_ = fStack_608 * fVar292 + fStack_628 * fVar312 + fStack_648 * fVar329;
      auVar120._28_4_ = fVar103 + fVar103 + fStack_204;
      auVar90 = vrcpps_avx(auVar120);
      fVar155 = auVar90._0_4_;
      fVar294 = auVar90._4_4_;
      auVar36._4_4_ = auVar120._4_4_ * fVar294;
      auVar36._0_4_ = auVar120._0_4_ * fVar155;
      fVar299 = auVar90._8_4_;
      auVar36._8_4_ = auVar120._8_4_ * fVar299;
      fVar331 = auVar90._12_4_;
      auVar36._12_4_ = auVar120._12_4_ * fVar331;
      fVar100 = auVar90._16_4_;
      auVar36._16_4_ = auVar120._16_4_ * fVar100;
      fVar101 = auVar90._20_4_;
      auVar36._20_4_ = auVar120._20_4_ * fVar101;
      fVar102 = auVar90._24_4_;
      auVar36._24_4_ = auVar120._24_4_ * fVar102;
      auVar36._28_4_ = fStack_824 + fVar300;
      auVar344._8_4_ = 0x3f800000;
      auVar344._0_8_ = 0x3f8000003f800000;
      auVar344._12_4_ = 0x3f800000;
      auVar344._16_4_ = 0x3f800000;
      auVar344._20_4_ = 0x3f800000;
      auVar344._24_4_ = 0x3f800000;
      auVar344._28_4_ = 0x3f800000;
      auVar172 = vsubps_avx(auVar344,auVar36);
      auVar264._8_4_ = 0x7fffffff;
      auVar264._0_8_ = 0x7fffffff7fffffff;
      auVar264._12_4_ = 0x7fffffff;
      auVar264._16_4_ = 0x7fffffff;
      auVar264._20_4_ = 0x7fffffff;
      auVar264._24_4_ = 0x7fffffff;
      auVar264._28_4_ = 0x7fffffff;
      auVar90 = vandps_avx(auVar264,auVar120);
      auVar355._8_4_ = 0x219392ef;
      auVar355._0_8_ = 0x219392ef219392ef;
      auVar355._12_4_ = 0x219392ef;
      auVar355._16_4_ = 0x219392ef;
      auVar355._20_4_ = 0x219392ef;
      auVar355._24_4_ = 0x219392ef;
      auVar355._28_4_ = 0x219392ef;
      auVar90 = vcmpps_avx(auVar90,auVar355,1);
      auVar37._4_4_ =
           (fVar294 + fVar294 * auVar172._4_4_) *
           -(fVar270 * fVar277 + fVar307 * fVar272 + fVar349 * fVar319);
      auVar37._0_4_ =
           (fVar155 + fVar155 * auVar172._0_4_) *
           -(fVar259 * fVar195 + fVar301 * fVar176 + fVar347 * fVar314);
      auVar37._8_4_ =
           (fVar299 + fVar299 * auVar172._8_4_) *
           -(fVar275 * fVar230 + fVar308 * fVar229 + fVar350 * fVar321);
      auVar37._12_4_ =
           (fVar331 + fVar331 * auVar172._12_4_) *
           -(fVar280 * fVar235 + fVar309 * fVar233 + fVar351 * fVar323);
      auVar37._16_4_ =
           (fVar100 + fVar100 * auVar172._16_4_) *
           -(fVar284 * fVar244 + fVar310 * fVar242 + fVar352 * fVar325);
      auVar37._20_4_ =
           (fVar101 + fVar101 * auVar172._20_4_) *
           -(fVar288 * fVar255 + fVar311 * fVar254 + fVar353 * fVar327);
      auVar37._24_4_ =
           (fVar102 + fVar102 * auVar172._24_4_) *
           -(fVar292 * fVar286 + fVar312 * fVar282 + fVar354 * fVar329);
      auVar37._28_4_ = -(fVar103 + auVar12._28_4_ + auVar162._12_4_);
      auVar12 = vcmpps_avx(auVar120,ZEXT832(0) << 0x20,1);
      auVar172 = vorps_avx(auVar90,auVar12);
      auVar12 = vcmpps_avx(auVar120,ZEXT832(0) << 0x20,6);
      auVar12 = vorps_avx(auVar90,auVar12);
      auVar335._8_4_ = 0xff800000;
      auVar335._0_8_ = 0xff800000ff800000;
      auVar335._12_4_ = 0xff800000;
      auVar335._16_4_ = 0xff800000;
      auVar335._20_4_ = 0xff800000;
      auVar335._24_4_ = 0xff800000;
      auVar335._28_4_ = 0xff800000;
      auVar90 = vblendvps_avx(auVar37,auVar335,auVar172);
      auVar348._8_4_ = 0x7f800000;
      auVar348._0_8_ = 0x7f8000007f800000;
      auVar348._12_4_ = 0x7f800000;
      auVar348._16_4_ = 0x7f800000;
      auVar348._20_4_ = 0x7f800000;
      auVar348._24_4_ = 0x7f800000;
      auVar348._28_4_ = 0x7f800000;
      auVar12 = vblendvps_avx(auVar37,auVar348,auVar12);
      auVar172 = vmaxps_avx(local_8c0,auVar90);
      auVar12 = vminps_avx(local_340,auVar12);
      auVar318 = ZEXT3264(auVar12);
      auVar92 = ZEXT832(0) << 0x20;
      auVar90 = vsubps_avx(auVar92,auVar10);
      auVar10 = vsubps_avx(auVar92,local_880);
      auVar38._4_4_ = auVar10._4_4_ * -fVar320;
      auVar38._0_4_ = auVar10._0_4_ * -fVar315;
      auVar38._8_4_ = auVar10._8_4_ * -fVar322;
      auVar38._12_4_ = auVar10._12_4_ * -fVar324;
      auVar38._16_4_ = auVar10._16_4_ * -fVar326;
      auVar38._20_4_ = auVar10._20_4_ * -fVar328;
      auVar38._24_4_ = auVar10._24_4_ * -fVar330;
      auVar38._28_4_ = auVar10._28_4_;
      auVar39._4_4_ = fVar337 * auVar90._4_4_;
      auVar39._0_4_ = fVar332 * auVar90._0_4_;
      auVar39._8_4_ = fVar338 * auVar90._8_4_;
      auVar39._12_4_ = fVar339 * auVar90._12_4_;
      auVar39._16_4_ = fVar340 * auVar90._16_4_;
      auVar39._20_4_ = fVar341 * auVar90._20_4_;
      auVar39._24_4_ = fVar342 * auVar90._24_4_;
      auVar39._28_4_ = auVar90._28_4_;
      auVar90 = vsubps_avx(auVar38,auVar39);
      auVar10 = vsubps_avx(auVar92,local_a00);
      auVar41._4_4_ = fVar271 * auVar10._4_4_;
      auVar41._0_4_ = fVar260 * auVar10._0_4_;
      auVar41._8_4_ = fVar276 * auVar10._8_4_;
      auVar41._12_4_ = fVar281 * auVar10._12_4_;
      auVar41._16_4_ = fVar285 * auVar10._16_4_;
      auVar41._20_4_ = fVar289 * auVar10._20_4_;
      uVar40 = auVar10._28_4_;
      auVar41._24_4_ = fVar293 * auVar10._24_4_;
      auVar41._28_4_ = uVar40;
      auVar92 = vsubps_avx(auVar90,auVar41);
      auVar42._4_4_ = fStack_65c * -fVar320;
      auVar42._0_4_ = local_660 * -fVar315;
      auVar42._8_4_ = fStack_658 * -fVar322;
      auVar42._12_4_ = fStack_654 * -fVar324;
      auVar42._16_4_ = fStack_650 * -fVar326;
      auVar42._20_4_ = fStack_64c * -fVar328;
      auVar42._24_4_ = fStack_648 * -fVar330;
      auVar42._28_4_ = uVar74 ^ 0x80000000;
      auVar43._4_4_ = fStack_63c * fVar337;
      auVar43._0_4_ = local_640 * fVar332;
      auVar43._8_4_ = fStack_638 * fVar338;
      auVar43._12_4_ = fStack_634 * fVar339;
      auVar43._16_4_ = fStack_630 * fVar340;
      auVar43._20_4_ = fStack_62c * fVar341;
      auVar43._24_4_ = fStack_628 * fVar342;
      auVar43._28_4_ = uVar40;
      auVar90 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = fStack_61c * fVar271;
      auVar44._0_4_ = local_620 * fVar260;
      auVar44._8_4_ = fStack_618 * fVar276;
      auVar44._12_4_ = fStack_614 * fVar281;
      auVar44._16_4_ = fStack_610 * fVar285;
      auVar44._20_4_ = fStack_60c * fVar289;
      auVar44._24_4_ = fStack_608 * fVar293;
      auVar44._28_4_ = uVar40;
      auVar13 = vsubps_avx(auVar90,auVar44);
      auVar90 = vrcpps_avx(auVar13);
      fVar155 = auVar90._0_4_;
      fVar176 = auVar90._4_4_;
      auVar45._4_4_ = auVar13._4_4_ * fVar176;
      auVar45._0_4_ = auVar13._0_4_ * fVar155;
      fVar195 = auVar90._8_4_;
      auVar45._8_4_ = auVar13._8_4_ * fVar195;
      fVar272 = auVar90._12_4_;
      auVar45._12_4_ = auVar13._12_4_ * fVar272;
      fVar277 = auVar90._16_4_;
      auVar45._16_4_ = auVar13._16_4_ * fVar277;
      fVar229 = auVar90._20_4_;
      auVar45._20_4_ = auVar13._20_4_ * fVar229;
      fVar230 = auVar90._24_4_;
      auVar45._24_4_ = auVar13._24_4_ * fVar230;
      auVar45._28_4_ = fStack_604;
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar93._16_4_ = 0x3f800000;
      auVar93._20_4_ = 0x3f800000;
      auVar93._24_4_ = 0x3f800000;
      auVar93._28_4_ = 0x3f800000;
      auVar14 = vsubps_avx(auVar93,auVar45);
      auVar90 = vandps_avx(auVar264,auVar13);
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar94._16_4_ = 0x219392ef;
      auVar94._20_4_ = 0x219392ef;
      auVar94._24_4_ = 0x219392ef;
      auVar94._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar90,auVar94,1);
      auVar46._4_4_ = (fVar176 + fVar176 * auVar14._4_4_) * -auVar92._4_4_;
      auVar46._0_4_ = (fVar155 + fVar155 * auVar14._0_4_) * -auVar92._0_4_;
      auVar46._8_4_ = (fVar195 + fVar195 * auVar14._8_4_) * -auVar92._8_4_;
      auVar46._12_4_ = (fVar272 + fVar272 * auVar14._12_4_) * -auVar92._12_4_;
      auVar46._16_4_ = (fVar277 + fVar277 * auVar14._16_4_) * -auVar92._16_4_;
      auVar46._20_4_ = (fVar229 + fVar229 * auVar14._20_4_) * -auVar92._20_4_;
      auVar46._24_4_ = (fVar230 + fVar230 * auVar14._24_4_) * -auVar92._24_4_;
      auVar46._28_4_ = auVar92._28_4_ ^ 0x80000000;
      auVar90 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,1);
      auVar90 = vorps_avx(auVar10,auVar90);
      auVar90 = vblendvps_avx(auVar46,auVar335,auVar90);
      local_8c0 = vmaxps_avx(auVar172,auVar90);
      auVar90 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,6);
      auVar90 = vorps_avx(auVar10,auVar90);
      auVar90 = vblendvps_avx(auVar46,auVar348,auVar90);
      auVar89 = vandps_avx(auVar89,local_320);
      local_5c0 = vminps_avx(auVar12,auVar90);
      auVar90 = vcmpps_avx(local_8c0,local_5c0,2);
      auVar10 = auVar89 & auVar90;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar10 >> 0x7f,0) == '\0') &&
            (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar10 >> 0xbf,0) == '\0') &&
          (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar10[0x1f])
      goto LAB_007a9109;
      auVar10 = vminps_avx(_local_ae0,local_8e0);
      auVar12 = vminps_avx(_local_7a0,_local_7c0);
      auVar10 = vminps_avx(auVar10,auVar12);
      auVar10 = vsubps_avx(auVar10,local_6c0);
      auVar89 = vandps_avx(auVar90,auVar89);
      auVar64._4_4_ = fStack_37c;
      auVar64._0_4_ = local_380;
      auVar64._8_4_ = fStack_378;
      auVar64._12_4_ = fStack_374;
      auVar64._16_4_ = fStack_370;
      auVar64._20_4_ = fStack_36c;
      auVar64._24_4_ = fStack_368;
      auVar64._28_4_ = uStack_364;
      auVar316._8_4_ = 0x3f800000;
      auVar316._0_8_ = 0x3f8000003f800000;
      auVar316._12_4_ = 0x3f800000;
      auVar316._16_4_ = 0x3f800000;
      auVar316._20_4_ = 0x3f800000;
      auVar316._24_4_ = 0x3f800000;
      auVar316._28_4_ = 0x3f800000;
      auVar90 = vminps_avx(auVar64,auVar316);
      auVar172 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar90 = vmaxps_avx(auVar90,ZEXT832(0) << 0x20);
      fVar155 = DAT_01f7b060._28_4_;
      local_1a0[0] = fVar133 + fVar104 * (auVar90._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1a0[1] = fVar152 + fVar129 * (auVar90._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1a0[2] = fVar153 + fVar130 * (auVar90._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1a0[3] = fVar154 + fVar132 * (auVar90._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_190 = fVar133 + fVar104 * (auVar90._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_18c = fVar152 + fVar129 * (auVar90._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_188 = fVar153 + fVar130 * (auVar90._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_184 = fVar154 + auVar90._28_4_ + fVar155;
      auVar65._4_4_ = fStack_35c;
      auVar65._0_4_ = local_360;
      auVar65._8_4_ = fStack_358;
      auVar65._12_4_ = fStack_354;
      auVar65._16_4_ = fStack_350;
      auVar65._20_4_ = fStack_34c;
      auVar65._24_4_ = fStack_348;
      auVar65._28_4_ = fStack_344;
      auVar90 = vminps_avx(auVar65,auVar316);
      auVar90 = vmaxps_avx(auVar90,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar133 + fVar104 * (auVar90._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1c0[1] = fVar152 + fVar129 * (auVar90._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1c0[2] = fVar153 + fVar130 * (auVar90._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1c0[3] = fVar154 + fVar132 * (auVar90._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_1b0 = fVar133 + fVar104 * (auVar90._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_1ac = fVar152 + fVar129 * (auVar90._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_1a8 = fVar153 + fVar130 * (auVar90._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_1a4 = fVar154 + auVar90._28_4_ + fVar155;
      auVar47._4_4_ = auVar10._4_4_ * 0.99999976;
      auVar47._0_4_ = auVar10._0_4_ * 0.99999976;
      auVar47._8_4_ = auVar10._8_4_ * 0.99999976;
      auVar47._12_4_ = auVar10._12_4_ * 0.99999976;
      auVar47._16_4_ = auVar10._16_4_ * 0.99999976;
      auVar47._20_4_ = auVar10._20_4_ * 0.99999976;
      auVar47._24_4_ = auVar10._24_4_ * 0.99999976;
      auVar47._28_4_ = 0x3f7ffffc;
      auVar90 = vmaxps_avx(ZEXT832(0) << 0x20,auVar47);
      auVar48._4_4_ = auVar90._4_4_ * auVar90._4_4_;
      auVar48._0_4_ = auVar90._0_4_ * auVar90._0_4_;
      auVar48._8_4_ = auVar90._8_4_ * auVar90._8_4_;
      auVar48._12_4_ = auVar90._12_4_ * auVar90._12_4_;
      auVar48._16_4_ = auVar90._16_4_ * auVar90._16_4_;
      auVar48._20_4_ = auVar90._20_4_ * auVar90._20_4_;
      auVar48._24_4_ = auVar90._24_4_ * auVar90._24_4_;
      auVar48._28_4_ = auVar90._28_4_;
      auVar10 = vsubps_avx(local_680,auVar48);
      auVar49._4_4_ = auVar10._4_4_ * (float)local_7e0._4_4_;
      auVar49._0_4_ = auVar10._0_4_ * (float)local_7e0._0_4_;
      auVar49._8_4_ = auVar10._8_4_ * fStack_7d8;
      auVar49._12_4_ = auVar10._12_4_ * fStack_7d4;
      auVar49._16_4_ = auVar10._16_4_ * fStack_7d0;
      auVar49._20_4_ = auVar10._20_4_ * fStack_7cc;
      auVar49._24_4_ = auVar10._24_4_ * fStack_7c8;
      auVar49._28_4_ = auVar90._28_4_;
      auVar12 = vsubps_avx(local_6a0,auVar49);
      auVar90 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,5);
      if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar90 >> 0x7f,0) == '\0') &&
            (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar90 >> 0xbf,0) == '\0') &&
          (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar90[0x1f])
      {
        auVar224 = SUB3228(ZEXT832(0),0) << 0x40;
        auVar203 = ZEXT828(0) << 0x20;
        auVar188 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar249 = ZEXT864(0) << 0x20;
        auVar298 = ZEXT864(0) << 0x20;
        auVar265._8_4_ = 0x7f800000;
        auVar265._0_8_ = 0x7f8000007f800000;
        auVar265._12_4_ = 0x7f800000;
        auVar265._16_4_ = 0x7f800000;
        auVar265._20_4_ = 0x7f800000;
        auVar265._24_4_ = 0x7f800000;
        auVar265._28_4_ = 0x7f800000;
        auVar303._8_4_ = 0xff800000;
        auVar303._0_8_ = 0xff800000ff800000;
        auVar303._12_4_ = 0xff800000;
        auVar303._16_4_ = 0xff800000;
        auVar303._20_4_ = 0xff800000;
        auVar303._24_4_ = 0xff800000;
        auVar303._28_4_ = 0xff800000;
      }
      else {
        local_980 = auVar10;
        local_9e0 = auVar90;
        auVar172 = vrcpps_avx(local_300);
        fVar176 = auVar172._0_4_;
        fVar195 = auVar172._4_4_;
        auVar50._4_4_ = local_300._4_4_ * fVar195;
        auVar50._0_4_ = local_300._0_4_ * fVar176;
        fVar272 = auVar172._8_4_;
        auVar50._8_4_ = local_300._8_4_ * fVar272;
        fVar277 = auVar172._12_4_;
        auVar50._12_4_ = local_300._12_4_ * fVar277;
        fVar229 = auVar172._16_4_;
        auVar50._16_4_ = local_300._16_4_ * fVar229;
        fVar230 = auVar172._20_4_;
        auVar50._20_4_ = local_300._20_4_ * fVar230;
        fVar233 = auVar172._24_4_;
        auVar50._24_4_ = local_300._24_4_ * fVar233;
        auVar50._28_4_ = auVar10._28_4_;
        auVar13 = vsubps_avx(auVar316,auVar50);
        auVar92 = vsqrtps_avx(auVar12);
        fVar176 = fVar176 + fVar176 * auVar13._0_4_;
        fVar195 = fVar195 + fVar195 * auVar13._4_4_;
        fVar272 = fVar272 + fVar272 * auVar13._8_4_;
        fVar277 = fVar277 + fVar277 * auVar13._12_4_;
        fVar229 = fVar229 + fVar229 * auVar13._16_4_;
        fVar230 = fVar230 + fVar230 * auVar13._20_4_;
        fVar233 = fVar233 + fVar233 * auVar13._24_4_;
        auVar14 = vsubps_avx(local_2e0,auVar92);
        fVar235 = auVar14._0_4_ * fVar176;
        fVar242 = auVar14._4_4_ * fVar195;
        auVar51._4_4_ = fVar242;
        auVar51._0_4_ = fVar235;
        fVar244 = auVar14._8_4_ * fVar272;
        auVar51._8_4_ = fVar244;
        fVar254 = auVar14._12_4_ * fVar277;
        auVar51._12_4_ = fVar254;
        fVar255 = auVar14._16_4_ * fVar229;
        auVar51._16_4_ = fVar255;
        fVar282 = auVar14._20_4_ * fVar230;
        auVar51._20_4_ = fVar282;
        fVar286 = auVar14._24_4_ * fVar233;
        auVar51._24_4_ = fVar286;
        auVar51._28_4_ = 0x7f800000;
        auVar14 = vsubps_avx(auVar92,local_8a0);
        auVar345._0_4_ = auVar14._0_4_ * fVar176;
        auVar345._4_4_ = auVar14._4_4_ * fVar195;
        auVar345._8_4_ = auVar14._8_4_ * fVar272;
        auVar345._12_4_ = auVar14._12_4_ * fVar277;
        auVar345._16_4_ = auVar14._16_4_ * fVar229;
        auVar345._20_4_ = auVar14._20_4_ * fVar230;
        auVar345._24_4_ = auVar14._24_4_ * fVar233;
        auVar345._28_4_ = 0;
        fVar176 = (fVar235 * local_540 + local_560._0_4_) * fVar177;
        fVar195 = (fVar242 * fStack_53c + local_560._4_4_) * fVar217;
        fVar272 = (fVar244 * fStack_538 + local_560._8_4_) * fVar214;
        fVar277 = (fVar254 * fStack_534 + local_560._12_4_) * fVar236;
        fVar229 = (fVar255 * fStack_530 + local_560._16_4_) * fVar250;
        fVar230 = (fVar282 * fStack_52c + local_560._20_4_) * fVar257;
        fVar233 = (fVar286 * fStack_528 + local_560._24_4_) * fVar290;
        auVar189._0_4_ = local_860 + fVar194 * fVar176;
        auVar189._4_4_ = fStack_85c + fVar267 * fVar195;
        auVar189._8_4_ = fStack_858 + fVar227 * fVar272;
        auVar189._12_4_ = fStack_854 + fVar232 * fVar277;
        auVar189._16_4_ = fStack_850 + fVar241 * fVar229;
        auVar189._20_4_ = fStack_84c + fVar253 * fVar230;
        auVar189._24_4_ = fStack_848 + fVar278 * fVar233;
        auVar189._28_4_ = fStack_844 + auVar14._28_4_;
        auVar52._4_4_ = fStack_61c * fVar242;
        auVar52._0_4_ = local_620 * fVar235;
        auVar52._8_4_ = fStack_618 * fVar244;
        auVar52._12_4_ = fStack_614 * fVar254;
        auVar52._16_4_ = fStack_610 * fVar255;
        auVar52._20_4_ = fStack_60c * fVar282;
        auVar52._24_4_ = fStack_608 * fVar286;
        auVar52._28_4_ = auVar92._28_4_;
        auVar14 = vsubps_avx(auVar52,auVar189);
        auVar208._0_4_ = fVar258 + fVar178 * fVar176;
        auVar208._4_4_ = fVar269 + fVar196 * fVar195;
        auVar208._8_4_ = fVar274 + fVar313 * fVar272;
        auVar208._12_4_ = fVar279 + fVar215 * fVar277;
        auVar208._16_4_ = fVar283 + fVar238 * fVar229;
        auVar208._20_4_ = fVar287 + fVar251 * fVar230;
        auVar208._24_4_ = fVar291 + fVar268 * fVar233;
        auVar208._28_4_ = fVar295 + auVar92._28_4_;
        auVar66._4_4_ = fStack_63c * fVar242;
        auVar66._0_4_ = local_640 * fVar235;
        auVar66._8_4_ = fStack_638 * fVar244;
        auVar66._12_4_ = fStack_634 * fVar254;
        auVar66._16_4_ = fStack_630 * fVar255;
        auVar66._20_4_ = fStack_62c * fVar282;
        auVar66._24_4_ = fStack_628 * fVar286;
        auVar66._28_4_ = fVar155;
        local_880 = vsubps_avx(auVar66,auVar208);
        auVar173._0_4_ = local_840 + fVar175 * fVar176;
        auVar173._4_4_ = fStack_83c + fVar256 * fVar195;
        auVar173._8_4_ = fStack_838 + fVar226 * fVar272;
        auVar173._12_4_ = aStack_834.w + fVar216 * fVar277;
        auVar173._16_4_ = fStack_830 + fVar239 * fVar229;
        auVar173._20_4_ = fStack_82c + fVar252 * fVar230;
        auVar173._24_4_ = fStack_828 + fVar273 * fVar233;
        auVar173._28_4_ = fStack_824 + auVar172._28_4_ + auVar13._28_4_ + local_560._28_4_;
        auVar53._4_4_ = fStack_65c * fVar242;
        auVar53._0_4_ = local_660 * fVar235;
        auVar53._8_4_ = fStack_658 * fVar244;
        auVar53._12_4_ = fStack_654 * fVar254;
        auVar53._16_4_ = fStack_650 * fVar255;
        auVar53._20_4_ = fStack_64c * fVar282;
        auVar53._24_4_ = fStack_648 * fVar286;
        auVar53._28_4_ = auVar208._28_4_;
        auVar172 = vsubps_avx(auVar53,auVar173);
        auVar298 = ZEXT3264(auVar172);
        fVar177 = (auVar345._0_4_ * local_540 + local_560._0_4_) * fVar177;
        fVar217 = (auVar345._4_4_ * fStack_53c + local_560._4_4_) * fVar217;
        fVar214 = (auVar345._8_4_ * fStack_538 + local_560._8_4_) * fVar214;
        fVar236 = (auVar345._12_4_ * fStack_534 + local_560._12_4_) * fVar236;
        fVar250 = (auVar345._16_4_ * fStack_530 + local_560._16_4_) * fVar250;
        fVar257 = (auVar345._20_4_ * fStack_52c + local_560._20_4_) * fVar257;
        fVar290 = (auVar345._24_4_ * fStack_528 + local_560._24_4_) * fVar290;
        auVar174._0_4_ = local_860 + fVar194 * fVar177;
        auVar174._4_4_ = fStack_85c + fVar267 * fVar217;
        auVar174._8_4_ = fStack_858 + fVar227 * fVar214;
        auVar174._12_4_ = fStack_854 + fVar232 * fVar236;
        auVar174._16_4_ = fStack_850 + fVar241 * fVar250;
        auVar174._20_4_ = fStack_84c + fVar253 * fVar257;
        auVar174._24_4_ = fStack_848 + fVar278 * fVar290;
        auVar174._28_4_ = fStack_844 + auVar173._28_4_ + local_560._28_4_;
        auVar54._4_4_ = fStack_61c * auVar345._4_4_;
        auVar54._0_4_ = local_620 * auVar345._0_4_;
        auVar54._8_4_ = fStack_618 * auVar345._8_4_;
        auVar54._12_4_ = fStack_614 * auVar345._12_4_;
        auVar54._16_4_ = fStack_610 * auVar345._16_4_;
        auVar54._20_4_ = fStack_60c * auVar345._20_4_;
        auVar54._24_4_ = fStack_608 * auVar345._24_4_;
        auVar54._28_4_ = fVar155;
        auVar172 = vsubps_avx(auVar54,auVar174);
        auVar225._0_4_ = fVar258 + fVar178 * fVar177;
        auVar225._4_4_ = fVar269 + fVar196 * fVar217;
        auVar225._8_4_ = fVar274 + fVar313 * fVar214;
        auVar225._12_4_ = fVar279 + fVar215 * fVar236;
        auVar225._16_4_ = fVar283 + fVar238 * fVar250;
        auVar225._20_4_ = fVar287 + fVar251 * fVar257;
        auVar225._24_4_ = fVar291 + fVar268 * fVar290;
        auVar225._28_4_ = fVar295 + fVar155;
        auVar55._4_4_ = fStack_63c * auVar345._4_4_;
        auVar55._0_4_ = local_640 * auVar345._0_4_;
        auVar55._8_4_ = fStack_638 * auVar345._8_4_;
        auVar55._12_4_ = fStack_634 * auVar345._12_4_;
        auVar55._16_4_ = fStack_630 * auVar345._16_4_;
        auVar55._20_4_ = fStack_62c * auVar345._20_4_;
        auVar55._24_4_ = fStack_628 * auVar345._24_4_;
        auVar55._28_4_ = fStack_604;
        auVar92 = vsubps_avx(auVar55,auVar225);
        auVar224 = auVar92._0_28_;
        auVar209._0_4_ = local_840 + fVar175 * fVar177;
        auVar209._4_4_ = fStack_83c + fVar256 * fVar217;
        auVar209._8_4_ = fStack_838 + fVar226 * fVar214;
        auVar209._12_4_ = aStack_834.w + fVar216 * fVar236;
        auVar209._16_4_ = fStack_830 + fVar239 * fVar250;
        auVar209._20_4_ = fStack_82c + fVar252 * fVar257;
        auVar209._24_4_ = fStack_828 + fVar273 * fVar290;
        auVar209._28_4_ = fStack_824 + auVar208._28_4_;
        auVar56._4_4_ = auVar345._4_4_ * fStack_65c;
        auVar56._0_4_ = auVar345._0_4_ * local_660;
        auVar56._8_4_ = auVar345._8_4_ * fStack_658;
        auVar56._12_4_ = auVar345._12_4_ * fStack_654;
        auVar56._16_4_ = auVar345._16_4_ * fStack_650;
        auVar56._20_4_ = auVar345._20_4_ * fStack_64c;
        auVar56._24_4_ = auVar345._24_4_ * fStack_648;
        auVar56._28_4_ = fStack_604;
        auVar92 = vsubps_avx(auVar56,auVar209);
        auVar203 = auVar92._0_28_;
        auVar12 = vcmpps_avx(auVar12,_DAT_01f7b000,5);
        auVar266._8_4_ = 0x7f800000;
        auVar266._0_8_ = 0x7f8000007f800000;
        auVar266._12_4_ = 0x7f800000;
        auVar266._16_4_ = 0x7f800000;
        auVar266._20_4_ = 0x7f800000;
        auVar266._24_4_ = 0x7f800000;
        auVar266._28_4_ = 0x7f800000;
        auVar265 = vblendvps_avx(auVar266,auVar51,auVar12);
        auVar92 = vmaxps_avx(local_500,local_3a0);
        auVar57._4_4_ = auVar92._4_4_ * 1.9073486e-06;
        auVar57._0_4_ = auVar92._0_4_ * 1.9073486e-06;
        auVar57._8_4_ = auVar92._8_4_ * 1.9073486e-06;
        auVar57._12_4_ = auVar92._12_4_ * 1.9073486e-06;
        auVar57._16_4_ = auVar92._16_4_ * 1.9073486e-06;
        auVar57._20_4_ = auVar92._20_4_ * 1.9073486e-06;
        auVar57._24_4_ = auVar92._24_4_ * 1.9073486e-06;
        auVar57._28_4_ = auVar92._28_4_;
        auVar92 = vcmpps_avx(_local_a40,auVar57,1);
        auVar304._8_4_ = 0xff800000;
        auVar304._0_8_ = 0xff800000ff800000;
        auVar304._12_4_ = 0xff800000;
        auVar304._16_4_ = 0xff800000;
        auVar304._20_4_ = 0xff800000;
        auVar304._24_4_ = 0xff800000;
        auVar304._28_4_ = 0xff800000;
        auVar303 = vblendvps_avx(auVar304,auVar345,auVar12);
        auVar13 = auVar12 & auVar92;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar90 = vandps_avx(auVar92,auVar12);
          auVar162 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
          auVar92 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,2);
          auVar128._8_4_ = 0xff800000;
          auVar128._0_8_ = 0xff800000ff800000;
          auVar128._12_4_ = 0xff800000;
          auVar128._16_4_ = 0xff800000;
          auVar128._20_4_ = 0xff800000;
          auVar128._24_4_ = 0xff800000;
          auVar128._28_4_ = 0xff800000;
          auVar193._8_4_ = 0x7f800000;
          auVar193._0_8_ = 0x7f8000007f800000;
          auVar193._12_4_ = 0x7f800000;
          auVar193._16_4_ = 0x7f800000;
          auVar193._20_4_ = 0x7f800000;
          auVar193._24_4_ = 0x7f800000;
          auVar193._28_4_ = 0x7f800000;
          auVar10 = vblendvps_avx(auVar193,auVar128,auVar92);
          auVar8 = vpmovsxwd_avx(auVar162);
          auVar162 = vpunpckhwd_avx(auVar162,auVar162);
          auVar346._16_16_ = auVar162;
          auVar346._0_16_ = auVar8;
          auVar265 = vblendvps_avx(auVar265,auVar10,auVar346);
          auVar10 = vblendvps_avx(auVar128,auVar193,auVar92);
          auVar303 = vblendvps_avx(auVar303,auVar10,auVar346);
          auVar151._0_8_ = auVar90._0_8_ ^ 0xffffffffffffffff;
          auVar151._8_4_ = auVar90._8_4_ ^ 0xffffffff;
          auVar151._12_4_ = auVar90._12_4_ ^ 0xffffffff;
          auVar151._16_4_ = auVar90._16_4_ ^ 0xffffffff;
          auVar151._20_4_ = auVar90._20_4_ ^ 0xffffffff;
          auVar151._24_4_ = auVar90._24_4_ ^ 0xffffffff;
          auVar151._28_4_ = auVar90._28_4_ ^ 0xffffffff;
          auVar90 = vorps_avx(auVar92,auVar151);
          auVar90 = vandps_avx(auVar12,auVar90);
        }
        auVar188 = auVar14._0_28_;
        auVar249 = ZEXT3264(local_880);
      }
      fVar155 = (ray->super_RayK<1>).dir.field_0.m128[0];
      auVar336 = ZEXT3264(CONCAT428(fVar155,CONCAT424(fVar155,CONCAT420(fVar155,CONCAT416(fVar155,
                                                  CONCAT412(fVar155,CONCAT48(fVar155,CONCAT44(
                                                  fVar155,fVar155))))))));
      fVar178 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar175 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar318 = ZEXT3264(CONCAT428(fVar175,CONCAT424(fVar175,CONCAT420(fVar175,CONCAT416(fVar175,
                                                  CONCAT412(fVar175,CONCAT48(fVar175,CONCAT44(
                                                  fVar175,fVar175))))))));
      local_5a0 = local_8c0;
      local_580 = vminps_avx(local_5c0,auVar265);
      _local_5e0 = vmaxps_avx(local_8c0,auVar303);
      auVar306 = ZEXT3264(_local_5e0);
      auVar10 = vcmpps_avx(local_8c0,local_580,2);
      local_680 = vandps_avx(auVar10,auVar89);
      auVar10 = vcmpps_avx(_local_5e0,local_5c0,2);
      _local_7e0 = vandps_avx(auVar10,auVar89);
      auVar89 = vorps_avx(local_680,_local_7e0);
      if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar89 >> 0x7f,0) != '\0') ||
            (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar89 >> 0xbf,0) != '\0') ||
          (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar89[0x1f] < '\0') {
        _local_7a0 = _local_5e0;
        local_8e0._0_4_ = uVar75;
        fVar194 = local_7e0._28_4_;
        auVar96._0_4_ =
             fVar155 * auVar172._0_4_ + fVar178 * auVar224._0_4_ + fVar175 * auVar203._0_4_;
        auVar96._4_4_ =
             fVar155 * auVar172._4_4_ + fVar178 * auVar224._4_4_ + fVar175 * auVar203._4_4_;
        auVar96._8_4_ =
             fVar155 * auVar172._8_4_ + fVar178 * auVar224._8_4_ + fVar175 * auVar203._8_4_;
        auVar96._12_4_ =
             fVar155 * auVar172._12_4_ + fVar178 * auVar224._12_4_ + fVar175 * auVar203._12_4_;
        auVar96._16_4_ =
             fVar155 * auVar172._16_4_ + fVar178 * auVar224._16_4_ + fVar175 * auVar203._16_4_;
        auVar96._20_4_ =
             fVar155 * auVar172._20_4_ + fVar178 * auVar224._20_4_ + fVar175 * auVar203._20_4_;
        auVar96._24_4_ =
             fVar155 * auVar172._24_4_ + fVar178 * auVar224._24_4_ + fVar175 * auVar203._24_4_;
        auVar96._28_4_ = fVar194 + fVar194 + auVar89._28_4_;
        auVar145._0_8_ = auVar90._0_8_ ^ 0xffffffffffffffff;
        auVar145._8_4_ = auVar90._8_4_ ^ 0xffffffff;
        auVar145._12_4_ = auVar90._12_4_ ^ 0xffffffff;
        auVar145._16_4_ = auVar90._16_4_ ^ 0xffffffff;
        auVar145._20_4_ = auVar90._20_4_ ^ 0xffffffff;
        auVar145._24_4_ = auVar90._24_4_ ^ 0xffffffff;
        auVar145._28_4_ = auVar90._28_4_ ^ 0xffffffff;
        auVar190._8_4_ = 0x7fffffff;
        auVar190._0_8_ = 0x7fffffff7fffffff;
        auVar190._12_4_ = 0x7fffffff;
        auVar190._16_4_ = 0x7fffffff;
        auVar190._20_4_ = 0x7fffffff;
        auVar190._24_4_ = 0x7fffffff;
        auVar190._28_4_ = 0x7fffffff;
        auVar89 = vandps_avx(auVar96,auVar190);
        auVar210._8_4_ = 0x3e99999a;
        auVar210._0_8_ = 0x3e99999a3e99999a;
        auVar210._12_4_ = 0x3e99999a;
        auVar210._16_4_ = 0x3e99999a;
        auVar210._20_4_ = 0x3e99999a;
        auVar210._24_4_ = 0x3e99999a;
        auVar210._28_4_ = 0x3e99999a;
        auVar89 = vcmpps_avx(auVar89,auVar210,1);
        local_6c0 = vorps_avx(auVar89,auVar145);
        auVar97._0_4_ =
             fVar155 * auVar188._0_4_ + fVar178 * auVar249._0_4_ + auVar298._0_4_ * fVar175;
        auVar97._4_4_ =
             fVar155 * auVar188._4_4_ + fVar178 * auVar249._4_4_ + auVar298._4_4_ * fVar175;
        auVar97._8_4_ =
             fVar155 * auVar188._8_4_ + fVar178 * auVar249._8_4_ + auVar298._8_4_ * fVar175;
        auVar97._12_4_ =
             fVar155 * auVar188._12_4_ + fVar178 * auVar249._12_4_ + auVar298._12_4_ * fVar175;
        auVar97._16_4_ =
             fVar155 * auVar188._16_4_ + fVar178 * auVar249._16_4_ + auVar298._16_4_ * fVar175;
        auVar97._20_4_ =
             fVar155 * auVar188._20_4_ + fVar178 * auVar249._20_4_ + auVar298._20_4_ * fVar175;
        auVar97._24_4_ =
             fVar155 * auVar188._24_4_ + fVar178 * auVar249._24_4_ + auVar298._24_4_ * fVar175;
        auVar97._28_4_ = fVar194 + auVar172._28_4_ + local_6c0._28_4_;
        auVar89 = vandps_avx(auVar97,auVar190);
        auVar89 = vcmpps_avx(auVar89,auVar210,1);
        auVar89 = vorps_avx(auVar89,auVar145);
        auVar122._8_4_ = 3;
        auVar122._0_8_ = 0x300000003;
        auVar122._12_4_ = 3;
        auVar122._16_4_ = 3;
        auVar122._20_4_ = 3;
        auVar122._24_4_ = 3;
        auVar122._28_4_ = 3;
        auVar146._8_4_ = 2;
        auVar146._0_8_ = 0x200000002;
        auVar146._12_4_ = 2;
        auVar146._16_4_ = 2;
        auVar146._20_4_ = 2;
        auVar146._24_4_ = 2;
        auVar146._28_4_ = 2;
        auVar89 = vblendvps_avx(auVar146,auVar122,auVar89);
        local_6e0 = ZEXT432(local_b0c);
        auVar8 = vpshufd_avx(ZEXT416(local_b0c),0);
        auVar162 = vpcmpgtd_avx(auVar89._16_16_,auVar8);
        local_700._0_16_ = auVar8;
        auVar8 = vpcmpgtd_avx(auVar89._0_16_,auVar8);
        auVar123._16_16_ = auVar162;
        auVar123._0_16_ = auVar8;
        local_6a0 = vblendps_avx(ZEXT1632(auVar8),auVar123,0xf0);
        auVar89 = vandnps_avx(local_6a0,local_680);
        local_7c0._4_4_ = local_8c0._4_4_ + local_800._4_4_;
        local_7c0._0_4_ = local_8c0._0_4_ + local_800._0_4_;
        fStack_7b8 = local_8c0._8_4_ + local_800._8_4_;
        fStack_7b4 = local_8c0._12_4_ + local_800._12_4_;
        fStack_7b0 = local_8c0._16_4_ + local_800._16_4_;
        fStack_7ac = local_8c0._20_4_ + local_800._20_4_;
        fStack_7a8 = local_8c0._24_4_ + local_800._24_4_;
        fStack_7a4 = local_8c0._28_4_ + local_800._28_4_;
        while( true ) {
          local_3c0 = auVar89;
          if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar89 >> 0x7f,0) == '\0') &&
                (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar89 >> 0xbf,0) == '\0') &&
              (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar89[0x1f]) break;
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar90 = vblendvps_avx(auVar124,local_8c0,auVar89);
          auVar10 = vshufps_avx(auVar90,auVar90,0xb1);
          auVar10 = vminps_avx(auVar90,auVar10);
          auVar12 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vminps_avx(auVar10,auVar12);
          auVar12 = vperm2f128_avx(auVar10,auVar10,1);
          auVar10 = vminps_avx(auVar10,auVar12);
          auVar90 = vcmpps_avx(auVar90,auVar10,0);
          auVar10 = auVar89 & auVar90;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            auVar89 = vandps_avx(auVar90,auVar89);
          }
          uVar68 = vmovmskps_avx(auVar89);
          uVar74 = 0;
          if (uVar68 != 0) {
            for (; (uVar68 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
            }
          }
          uVar71 = (ulong)uVar74;
          *(undefined4 *)(local_3c0 + uVar71 * 4) = 0;
          aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
          local_840 = aVar2.x;
          fStack_83c = aVar2.y;
          fStack_838 = aVar2.z;
          aStack_834 = aVar2.field_3;
          auVar162 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
          fVar155 = local_1a0[uVar71];
          uVar74 = *(uint *)(local_5a0 + uVar71 * 4);
          if (auVar162._0_4_ < 0.0) {
            auVar306 = ZEXT1664(auVar306._0_16_);
            auVar318 = ZEXT1664(auVar318._0_16_);
            auVar336 = ZEXT1664(auVar336._0_16_);
            fVar178 = sqrtf(auVar162._0_4_);
          }
          else {
            auVar162 = vsqrtss_avx(auVar162,auVar162);
            fVar178 = auVar162._0_4_;
          }
          auVar249 = ZEXT464(uVar74);
          auVar8 = vminps_avx(_local_990,_local_9b0);
          auVar162 = vmaxps_avx(_local_990,_local_9b0);
          auVar9 = vminps_avx(_local_9a0,_local_9c0);
          auVar83 = vminps_avx(auVar8,auVar9);
          auVar8 = vmaxps_avx(_local_9a0,_local_9c0);
          auVar9 = vmaxps_avx(auVar162,auVar8);
          auVar159._8_4_ = 0x7fffffff;
          auVar159._0_8_ = 0x7fffffff7fffffff;
          auVar159._12_4_ = 0x7fffffff;
          auVar162 = vandps_avx(auVar83,auVar159);
          auVar8 = vandps_avx(auVar9,auVar159);
          auVar162 = vmaxps_avx(auVar162,auVar8);
          auVar8 = vmovshdup_avx(auVar162);
          auVar8 = vmaxss_avx(auVar8,auVar162);
          auVar162 = vshufpd_avx(auVar162,auVar162,1);
          auVar162 = vmaxss_avx(auVar162,auVar8);
          local_860 = auVar162._0_4_ * 1.9073486e-06;
          local_980._0_4_ = fVar178 * 1.9073486e-06;
          local_780._0_16_ = vshufps_avx(auVar9,auVar9,0xff);
          auVar162 = vinsertps_avx(ZEXT416(uVar74),ZEXT416((uint)fVar155),0x10);
          auVar298 = ZEXT1664(auVar162);
          lVar70 = 5;
          do {
            do {
              auVar162 = auVar298._0_16_;
              bVar77 = lVar70 == 0;
              lVar70 = lVar70 + -1;
              if (bVar77) goto LAB_007a9eef;
              auVar9 = vmovshdup_avx(auVar162);
              fVar155 = auVar9._0_4_;
              fVar177 = 1.0 - fVar155;
              fVar178 = fVar177 * fVar177;
              fVar175 = fVar177 * fVar178;
              fVar194 = fVar155 * fVar155;
              fVar176 = fVar155 * fVar194;
              fVar195 = fVar155 * fVar177;
              auVar8 = vshufps_avx(ZEXT416((uint)(fVar176 * 0.16666667)),
                                   ZEXT416((uint)(fVar176 * 0.16666667)),0);
              auVar83 = ZEXT416((uint)((fVar176 * 4.0 + fVar175 +
                                       fVar155 * fVar195 * 12.0 + fVar177 * fVar195 * 6.0) *
                                      0.16666667));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              auVar108 = ZEXT416((uint)((fVar175 * 4.0 + fVar176 +
                                        fVar177 * fVar195 * 12.0 + fVar155 * fVar195 * 6.0) *
                                       0.16666667));
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              auVar82 = vshufps_avx(auVar162,auVar162,0);
              auVar138._0_4_ = auVar82._0_4_ * local_840 + 0.0;
              auVar138._4_4_ = auVar82._4_4_ * fStack_83c + 0.0;
              auVar138._8_4_ = auVar82._8_4_ * fStack_838 + 0.0;
              auVar138._12_4_ = auVar82._12_4_ * aStack_834.w + 0.0;
              auVar82 = vshufps_avx(ZEXT416((uint)(fVar175 * 0.16666667)),
                                    ZEXT416((uint)(fVar175 * 0.16666667)),0);
              auVar81._0_4_ =
                   auVar82._0_4_ * (float)local_990._0_4_ +
                   auVar108._0_4_ * (float)local_9b0._0_4_ +
                   auVar8._0_4_ * (float)local_9c0._0_4_ + auVar83._0_4_ * (float)local_9a0._0_4_;
              auVar81._4_4_ =
                   auVar82._4_4_ * (float)local_990._4_4_ +
                   auVar108._4_4_ * (float)local_9b0._4_4_ +
                   auVar8._4_4_ * (float)local_9c0._4_4_ + auVar83._4_4_ * (float)local_9a0._4_4_;
              auVar81._8_4_ =
                   auVar82._8_4_ * fStack_988 +
                   auVar108._8_4_ * fStack_9a8 +
                   auVar8._8_4_ * fStack_9b8 + auVar83._8_4_ * fStack_998;
              auVar81._12_4_ =
                   auVar82._12_4_ * fStack_984 +
                   auVar108._12_4_ * fStack_9a4 +
                   auVar8._12_4_ * fStack_9b4 + auVar83._12_4_ * fStack_994;
              local_880._0_16_ = auVar81;
              auVar8 = vsubps_avx(auVar138,auVar81);
              _local_a40 = auVar8;
              auVar8 = vdpps_avx(auVar8,auVar8,0x7f);
              fVar175 = auVar8._0_4_;
              if (fVar175 < 0.0) {
                local_9e0._0_16_ = auVar9;
                local_900._0_4_ = fVar194;
                local_a00._0_4_ = fVar178;
                local_a20._0_4_ = fVar195;
                fVar176 = sqrtf(fVar175);
                fVar178 = (float)local_a00._0_4_;
                fVar194 = (float)local_900._0_4_;
                fVar195 = (float)local_a20._0_4_;
                fVar155 = (float)local_9e0._0_4_;
              }
              else {
                auVar9 = vsqrtss_avx(auVar8,auVar8);
                fVar176 = auVar9._0_4_;
              }
              auVar9 = vshufps_avx(ZEXT416((uint)(fVar194 * 0.5)),ZEXT416((uint)(fVar194 * 0.5)),0);
              auVar83 = ZEXT416((uint)((fVar178 + fVar195 * 4.0) * 0.5));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              auVar108 = ZEXT416((uint)((fVar155 * -fVar155 - fVar195 * 4.0) * 0.5));
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              auVar82 = ZEXT416((uint)(fVar177 * -fVar177 * 0.5));
              auVar82 = vshufps_avx(auVar82,auVar82,0);
              auVar261._0_4_ =
                   (float)local_990._0_4_ * auVar82._0_4_ +
                   (float)local_9b0._0_4_ * auVar108._0_4_ +
                   (float)local_9c0._0_4_ * auVar9._0_4_ + (float)local_9a0._0_4_ * auVar83._0_4_;
              auVar261._4_4_ =
                   (float)local_990._4_4_ * auVar82._4_4_ +
                   (float)local_9b0._4_4_ * auVar108._4_4_ +
                   (float)local_9c0._4_4_ * auVar9._4_4_ + (float)local_9a0._4_4_ * auVar83._4_4_;
              auVar261._8_4_ =
                   fStack_988 * auVar82._8_4_ +
                   fStack_9a8 * auVar108._8_4_ +
                   fStack_9b8 * auVar9._8_4_ + fStack_998 * auVar83._8_4_;
              auVar261._12_4_ =
                   fStack_984 * auVar82._12_4_ +
                   fStack_9a4 * auVar108._12_4_ +
                   fStack_9b4 * auVar9._12_4_ + fStack_994 * auVar83._12_4_;
              auVar9 = vshufps_avx(auVar162,auVar162,0x55);
              auVar83 = ZEXT416((uint)(fVar177 - (fVar155 + fVar155)));
              auVar108 = vshufps_avx(auVar83,auVar83,0);
              auVar83 = ZEXT416((uint)(fVar155 - (fVar177 + fVar177)));
              auVar82 = vshufps_avx(auVar83,auVar83,0);
              auVar78 = vshufps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),0);
              auVar83 = vdpps_avx(auVar261,auVar261,0x7f);
              auVar109._0_4_ =
                   (float)local_990._0_4_ * auVar78._0_4_ +
                   (float)local_9b0._0_4_ * auVar82._0_4_ +
                   (float)local_9c0._0_4_ * auVar9._0_4_ + (float)local_9a0._0_4_ * auVar108._0_4_;
              auVar109._4_4_ =
                   (float)local_990._4_4_ * auVar78._4_4_ +
                   (float)local_9b0._4_4_ * auVar82._4_4_ +
                   (float)local_9c0._4_4_ * auVar9._4_4_ + (float)local_9a0._4_4_ * auVar108._4_4_;
              auVar109._8_4_ =
                   fStack_988 * auVar78._8_4_ +
                   fStack_9a8 * auVar82._8_4_ +
                   fStack_9b8 * auVar9._8_4_ + fStack_998 * auVar108._8_4_;
              auVar109._12_4_ =
                   fStack_984 * auVar78._12_4_ +
                   fStack_9a4 * auVar82._12_4_ +
                   fStack_9b4 * auVar9._12_4_ + fStack_994 * auVar108._12_4_;
              auVar9 = vblendps_avx(auVar83,_DAT_01f45a50,0xe);
              auVar108 = vrsqrtss_avx(auVar9,auVar9);
              fVar178 = auVar108._0_4_;
              fVar155 = auVar83._0_4_;
              auVar108 = vdpps_avx(auVar261,auVar109,0x7f);
              auVar82 = vshufps_avx(auVar83,auVar83,0);
              auVar110._0_4_ = auVar109._0_4_ * auVar82._0_4_;
              auVar110._4_4_ = auVar109._4_4_ * auVar82._4_4_;
              auVar110._8_4_ = auVar109._8_4_ * auVar82._8_4_;
              auVar110._12_4_ = auVar109._12_4_ * auVar82._12_4_;
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              auVar180._0_4_ = auVar261._0_4_ * auVar108._0_4_;
              auVar180._4_4_ = auVar261._4_4_ * auVar108._4_4_;
              auVar180._8_4_ = auVar261._8_4_ * auVar108._8_4_;
              auVar180._12_4_ = auVar261._12_4_ * auVar108._12_4_;
              auVar78 = vsubps_avx(auVar110,auVar180);
              auVar108 = vrcpss_avx(auVar9,auVar9);
              auVar9 = vmaxss_avx(ZEXT416((uint)local_860),
                                  ZEXT416((uint)(auVar298._0_4_ * (float)local_980._0_4_)));
              auVar306 = ZEXT1664(auVar9);
              auVar108 = ZEXT416((uint)(auVar108._0_4_ * (2.0 - fVar155 * auVar108._0_4_)));
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              uVar71 = CONCAT44(auVar261._4_4_,auVar261._0_4_);
              auVar199._0_8_ = uVar71 ^ 0x8000000080000000;
              auVar199._8_4_ = -auVar261._8_4_;
              auVar199._12_4_ = -auVar261._12_4_;
              auVar82 = ZEXT416((uint)(fVar178 * 1.5 + fVar155 * -0.5 * fVar178 * fVar178 * fVar178)
                               );
              auVar82 = vshufps_avx(auVar82,auVar82,0);
              auVar160._0_4_ = auVar82._0_4_ * auVar78._0_4_ * auVar108._0_4_;
              auVar160._4_4_ = auVar82._4_4_ * auVar78._4_4_ * auVar108._4_4_;
              auVar160._8_4_ = auVar82._8_4_ * auVar78._8_4_ * auVar108._8_4_;
              auVar160._12_4_ = auVar82._12_4_ * auVar78._12_4_ * auVar108._12_4_;
              auVar222._0_4_ = auVar261._0_4_ * auVar82._0_4_;
              auVar222._4_4_ = auVar261._4_4_ * auVar82._4_4_;
              auVar222._8_4_ = auVar261._8_4_ * auVar82._8_4_;
              auVar222._12_4_ = auVar261._12_4_ * auVar82._12_4_;
              local_9e0._0_4_ = auVar9._0_4_;
              if (fVar155 < 0.0) {
                local_900._0_4_ = fVar176;
                local_a00._0_16_ = auVar199;
                local_a20._0_16_ = auVar222;
                local_920._0_16_ = auVar160;
                fVar155 = sqrtf(fVar155);
                auVar306 = ZEXT464((uint)local_9e0._0_4_);
                auVar160 = local_920._0_16_;
                auVar199 = local_a00._0_16_;
                auVar222 = local_a20._0_16_;
                fVar176 = (float)local_900._0_4_;
              }
              else {
                auVar9 = vsqrtss_avx(auVar83,auVar83);
                fVar155 = auVar9._0_4_;
              }
              auVar9 = vdpps_avx(_local_a40,auVar222,0x7f);
              fVar155 = (local_860 / fVar155) * (fVar176 + 1.0) +
                        auVar306._0_4_ + fVar176 * local_860;
              auVar83 = vdpps_avx(auVar199,auVar222,0x7f);
              auVar108 = vdpps_avx(_local_a40,auVar160,0x7f);
              auVar61._4_4_ = fStack_83c;
              auVar61._0_4_ = local_840;
              auVar61._8_4_ = fStack_838;
              auVar61._12_4_ = aStack_834.a;
              auVar82 = vdpps_avx(auVar61,auVar222,0x7f);
              auVar78 = vdpps_avx(_local_a40,auVar199,0x7f);
              fVar178 = auVar83._0_4_ + auVar108._0_4_;
              fVar194 = auVar9._0_4_;
              auVar84._0_4_ = fVar194 * fVar194;
              auVar84._4_4_ = auVar9._4_4_ * auVar9._4_4_;
              auVar84._8_4_ = auVar9._8_4_ * auVar9._8_4_;
              auVar84._12_4_ = auVar9._12_4_ * auVar9._12_4_;
              auVar108 = vsubps_avx(auVar8,auVar84);
              auVar83 = vdpps_avx(_local_a40,auVar61,0x7f);
              fVar176 = auVar78._0_4_ - fVar194 * fVar178;
              fVar195 = auVar83._0_4_ - fVar194 * auVar82._0_4_;
              auVar83 = vrsqrtss_avx(auVar108,auVar108);
              fVar177 = auVar108._0_4_;
              fVar194 = auVar83._0_4_;
              fVar194 = fVar194 * 1.5 + fVar177 * -0.5 * fVar194 * fVar194 * fVar194;
              if (fVar177 < 0.0) {
                local_900._0_16_ = auVar9;
                local_a00._0_4_ = fVar155;
                local_a20._0_16_ = auVar82;
                local_920._0_16_ = ZEXT416((uint)fVar178);
                local_740._0_4_ = fVar176;
                local_8a0._0_4_ = fVar195;
                local_760._0_4_ = fVar194;
                fVar177 = sqrtf(fVar177);
                auVar306 = ZEXT464((uint)local_9e0._0_4_);
                fVar194 = (float)local_760._0_4_;
                fVar176 = (float)local_740._0_4_;
                fVar195 = (float)local_8a0._0_4_;
                auVar82 = local_a20._0_16_;
                fVar155 = (float)local_a00._0_4_;
                auVar9 = local_900._0_16_;
                auVar83 = local_920._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar108,auVar108);
                fVar177 = auVar83._0_4_;
                auVar83 = ZEXT416((uint)fVar178);
              }
              auVar336 = ZEXT1664(auVar9);
              auVar318 = ZEXT464((uint)fVar155);
              auVar249 = ZEXT1664(auVar8);
              auVar78 = vpermilps_avx(local_880._0_16_,0xff);
              auVar106 = vshufps_avx(auVar261,auVar261,0xff);
              fVar178 = fVar176 * fVar194 - auVar106._0_4_;
              auVar181._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
              auVar181._8_4_ = auVar82._8_4_ ^ 0x80000000;
              auVar181._12_4_ = auVar82._12_4_ ^ 0x80000000;
              auVar200._0_4_ = -fVar178;
              auVar200._4_4_ = 0x80000000;
              auVar200._8_4_ = 0x80000000;
              auVar200._12_4_ = 0x80000000;
              auVar108 = vinsertps_avx(auVar200,ZEXT416((uint)(fVar195 * fVar194)),0x1c);
              auVar82 = vmovsldup_avx(ZEXT416((uint)(auVar83._0_4_ * fVar195 * fVar194 -
                                                    auVar82._0_4_ * fVar178)));
              auVar108 = vdivps_avx(auVar108,auVar82);
              auVar83 = vinsertps_avx(auVar83,auVar181,0x10);
              auVar83 = vdivps_avx(auVar83,auVar82);
              auVar82 = vmovsldup_avx(auVar9);
              auVar85 = ZEXT416((uint)(fVar177 - auVar78._0_4_));
              auVar78 = vmovsldup_avx(auVar85);
              auVar139._0_4_ = auVar82._0_4_ * auVar108._0_4_ + auVar78._0_4_ * auVar83._0_4_;
              auVar139._4_4_ = auVar82._4_4_ * auVar108._4_4_ + auVar78._4_4_ * auVar83._4_4_;
              auVar139._8_4_ = auVar82._8_4_ * auVar108._8_4_ + auVar78._8_4_ * auVar83._8_4_;
              auVar139._12_4_ = auVar82._12_4_ * auVar108._12_4_ + auVar78._12_4_ * auVar83._12_4_;
              auVar83 = vsubps_avx(auVar162,auVar139);
              auVar298 = ZEXT1664(auVar83);
              auVar140._8_4_ = 0x7fffffff;
              auVar140._0_8_ = 0x7fffffff7fffffff;
              auVar140._12_4_ = 0x7fffffff;
              auVar162 = vandps_avx(auVar9,auVar140);
            } while (fVar155 <= auVar162._0_4_);
            auVar161._8_4_ = 0x7fffffff;
            auVar161._0_8_ = 0x7fffffff7fffffff;
            auVar161._12_4_ = 0x7fffffff;
            auVar162 = vandps_avx(auVar85,auVar161);
          } while ((float)local_780._0_4_ * 1.9073486e-06 + auVar306._0_4_ + fVar155 <=
                   auVar162._0_4_);
          fVar178 = auVar83._0_4_ + (float)local_820._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar178) &&
             (fVar194 = (ray->super_RayK<1>).tfar, fVar178 <= fVar194)) {
            auVar162 = vmovshdup_avx(auVar83);
            fVar176 = auVar162._0_4_;
            if ((0.0 <= fVar176) && (fVar176 <= 1.0)) {
              auVar162 = vrsqrtss_avx(auVar8,auVar8);
              fVar195 = auVar162._0_4_;
              pGVar5 = (context->scene->geometries).items[uVar67].ptr;
              if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar162 = ZEXT416((uint)(fVar195 * 1.5 +
                                         fVar175 * -0.5 * fVar195 * fVar195 * fVar195));
                auVar162 = vshufps_avx(auVar162,auVar162,0);
                auVar163._0_4_ = auVar162._0_4_ * (float)local_a40._0_4_;
                auVar163._4_4_ = auVar162._4_4_ * (float)local_a40._4_4_;
                auVar163._8_4_ = auVar162._8_4_ * fStack_a38;
                auVar163._12_4_ = auVar162._12_4_ * fStack_a34;
                auVar111._0_4_ = auVar261._0_4_ + auVar106._0_4_ * auVar163._0_4_;
                auVar111._4_4_ = auVar261._4_4_ + auVar106._4_4_ * auVar163._4_4_;
                auVar111._8_4_ = auVar261._8_4_ + auVar106._8_4_ * auVar163._8_4_;
                auVar111._12_4_ = auVar261._12_4_ + auVar106._12_4_ * auVar163._12_4_;
                auVar162 = vshufps_avx(auVar163,auVar163,0xc9);
                auVar108 = vshufps_avx(auVar261,auVar261,0xc9);
                auVar164._0_4_ = auVar108._0_4_ * auVar163._0_4_;
                auVar164._4_4_ = auVar108._4_4_ * auVar163._4_4_;
                auVar164._8_4_ = auVar108._8_4_ * auVar163._8_4_;
                auVar164._12_4_ = auVar108._12_4_ * auVar163._12_4_;
                auVar182._0_4_ = auVar261._0_4_ * auVar162._0_4_;
                auVar182._4_4_ = auVar261._4_4_ * auVar162._4_4_;
                auVar182._8_4_ = auVar261._8_4_ * auVar162._8_4_;
                auVar182._12_4_ = auVar261._12_4_ * auVar162._12_4_;
                auVar82 = vsubps_avx(auVar182,auVar164);
                auVar162 = vshufps_avx(auVar82,auVar82,0xc9);
                auVar108 = vshufps_avx(auVar111,auVar111,0xc9);
                auVar183._0_4_ = auVar108._0_4_ * auVar162._0_4_;
                auVar183._4_4_ = auVar108._4_4_ * auVar162._4_4_;
                auVar183._8_4_ = auVar108._8_4_ * auVar162._8_4_;
                auVar183._12_4_ = auVar108._12_4_ * auVar162._12_4_;
                auVar162 = vshufps_avx(auVar82,auVar82,0xd2);
                auVar112._0_4_ = auVar111._0_4_ * auVar162._0_4_;
                auVar112._4_4_ = auVar111._4_4_ * auVar162._4_4_;
                auVar112._8_4_ = auVar111._8_4_ * auVar162._8_4_;
                auVar112._12_4_ = auVar111._12_4_ * auVar162._12_4_;
                auVar108 = vsubps_avx(auVar183,auVar112);
                auVar162 = vshufps_avx(auVar108,auVar108,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar178;
                  uVar1 = vmovlps_avx(auVar162);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                  (ray->Ng).field_0.field_0.z = auVar108._0_4_;
                  ray->u = fVar176;
                  ray->v = 0.0;
                  ray->primID = local_8e0._0_4_;
                  ray->geomID = uVar67;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_950 = vmovlps_avx(auVar162);
                  local_948 = auVar108._0_4_;
                  local_944 = fVar176;
                  local_940 = 0;
                  local_93c = local_8e0._0_4_;
                  local_938 = uVar67;
                  local_934 = context->user->instID[0];
                  local_930 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar178;
                  local_720._0_4_ = 0xffffffff;
                  local_a78.valid = (int *)local_720;
                  local_a78.geometryUserPtr = pGVar5->userPtr;
                  local_a78.context = context->user;
                  local_a78.hit = (RTCHitN *)&local_950;
                  local_a78.N = 1;
                  local_a78.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_007aa00d:
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      auVar298 = ZEXT1664(auVar298._0_16_);
                      auVar306 = ZEXT1664(auVar306._0_16_);
                      auVar318 = ZEXT1664(auVar318._0_16_);
                      auVar336 = ZEXT1664(auVar336._0_16_);
                      (*p_Var6)(&local_a78);
                      if (*local_a78.valid == 0) goto LAB_007aa0ad;
                    }
                    (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                         *(float *)local_a78.hit;
                    (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_a78.hit + 4);
                    (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_a78.hit + 8);
                    *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc);
                    *(float *)((long)local_a78.ray + 0x40) = *(float *)(local_a78.hit + 0x10);
                    *(float *)((long)local_a78.ray + 0x44) = *(float *)(local_a78.hit + 0x14);
                    *(float *)((long)local_a78.ray + 0x48) = *(float *)(local_a78.hit + 0x18);
                    *(float *)((long)local_a78.ray + 0x4c) = *(float *)(local_a78.hit + 0x1c);
                    *(float *)((long)local_a78.ray + 0x50) = *(float *)(local_a78.hit + 0x20);
                  }
                  else {
                    auVar249 = ZEXT1664(auVar8);
                    auVar298 = ZEXT1664(auVar83);
                    auVar306 = ZEXT1664(auVar306._0_16_);
                    auVar318 = ZEXT464((uint)fVar155);
                    auVar336 = ZEXT1664(auVar9);
                    (*pGVar5->intersectionFilterN)(&local_a78);
                    if (*local_a78.valid != 0) goto LAB_007aa00d;
LAB_007aa0ad:
                    (ray->super_RayK<1>).tfar = fVar194;
                  }
                }
              }
            }
          }
LAB_007a9eef:
          fVar155 = (ray->super_RayK<1>).tfar;
          auVar98._4_4_ = fVar155;
          auVar98._0_4_ = fVar155;
          auVar98._8_4_ = fVar155;
          auVar98._12_4_ = fVar155;
          auVar98._16_4_ = fVar155;
          auVar98._20_4_ = fVar155;
          auVar98._24_4_ = fVar155;
          auVar98._28_4_ = fVar155;
          auVar89 = vcmpps_avx(_local_7c0,auVar98,2);
          auVar89 = vandps_avx(auVar89,local_3c0);
        }
        auVar125._0_4_ = local_800._0_4_ + (float)local_7a0._0_4_;
        auVar125._4_4_ = local_800._4_4_ + (float)local_7a0._4_4_;
        auVar125._8_4_ = local_800._8_4_ + fStack_798;
        auVar125._12_4_ = local_800._12_4_ + fStack_794;
        auVar125._16_4_ = local_800._16_4_ + fStack_790;
        auVar125._20_4_ = local_800._20_4_ + fStack_78c;
        auVar125._24_4_ = local_800._24_4_ + fStack_788;
        auVar125._28_4_ = local_800._28_4_ + fStack_784;
        auVar89 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        fVar155 = (ray->super_RayK<1>).tfar;
        auVar147._4_4_ = fVar155;
        auVar147._0_4_ = fVar155;
        auVar147._8_4_ = fVar155;
        auVar147._12_4_ = fVar155;
        auVar147._16_4_ = fVar155;
        auVar147._20_4_ = fVar155;
        auVar147._24_4_ = fVar155;
        auVar147._28_4_ = fVar155;
        auVar90 = vcmpps_avx(auVar125,auVar147,2);
        _local_7c0 = vandps_avx(auVar90,_local_7e0);
        auVar126._8_4_ = 3;
        auVar126._0_8_ = 0x300000003;
        auVar126._12_4_ = 3;
        auVar126._16_4_ = 3;
        auVar126._20_4_ = 3;
        auVar126._24_4_ = 3;
        auVar126._28_4_ = 3;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar90 = vblendvps_avx(auVar148,auVar126,local_6c0);
        auVar162 = vpcmpgtd_avx(auVar90._16_16_,local_700._0_16_);
        auVar8 = vpshufd_avx(local_6e0._0_16_,0);
        auVar8 = vpcmpgtd_avx(auVar90._0_16_,auVar8);
        auVar149._16_16_ = auVar162;
        auVar149._0_16_ = auVar89._0_16_;
        _local_7e0 = vblendps_avx(ZEXT1632(auVar8),auVar149,0xf0);
        auVar90 = vandnps_avx(_local_7e0,_local_7c0);
        local_8c0 = _local_5e0;
        local_7a0._4_4_ = local_800._4_4_ + (float)local_5e0._4_4_;
        local_7a0._0_4_ = local_800._0_4_ + (float)local_5e0._0_4_;
        fStack_798 = local_800._8_4_ + fStack_5d8;
        fStack_794 = local_800._12_4_ + fStack_5d4;
        fStack_790 = local_800._16_4_ + fStack_5d0;
        fStack_78c = local_800._20_4_ + fStack_5cc;
        fStack_788 = local_800._24_4_ + fStack_5c8;
        fStack_784 = local_800._28_4_ + fStack_5c4;
        while( true ) {
          local_720 = auVar90;
          if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar90 >> 0x7f,0) == '\0') &&
                (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar90 >> 0xbf,0) == '\0') &&
              (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar90[0x1f]) break;
          auVar99._8_4_ = 0x7f800000;
          auVar99._0_8_ = 0x7f8000007f800000;
          auVar99._12_4_ = 0x7f800000;
          auVar99._16_4_ = 0x7f800000;
          auVar99._20_4_ = 0x7f800000;
          auVar99._24_4_ = 0x7f800000;
          auVar99._28_4_ = 0x7f800000;
          auVar89 = vblendvps_avx(auVar99,local_8c0,auVar90);
          auVar10 = vshufps_avx(auVar89,auVar89,0xb1);
          auVar10 = vminps_avx(auVar89,auVar10);
          auVar12 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vminps_avx(auVar10,auVar12);
          auVar12 = vperm2f128_avx(auVar10,auVar10,1);
          auVar10 = vminps_avx(auVar10,auVar12);
          auVar89 = vcmpps_avx(auVar89,auVar10,0);
          auVar10 = auVar90 & auVar89;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            auVar90 = vandps_avx(auVar89,auVar90);
          }
          uVar68 = vmovmskps_avx(auVar90);
          uVar74 = 0;
          if (uVar68 != 0) {
            for (; (uVar68 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
            }
          }
          uVar71 = (ulong)uVar74;
          *(undefined4 *)(local_720 + uVar71 * 4) = 0;
          aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
          local_840 = aVar2.x;
          fStack_83c = aVar2.y;
          fStack_838 = aVar2.z;
          aStack_834 = aVar2.field_3;
          auVar162 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
          fVar155 = local_1c0[uVar71];
          uVar74 = *(uint *)(local_5c0 + uVar71 * 4);
          if (auVar162._0_4_ < 0.0) {
            auVar298 = ZEXT1664(auVar298._0_16_);
            auVar306 = ZEXT1664(auVar306._0_16_);
            auVar336 = ZEXT1664(auVar336._0_16_);
            fVar178 = sqrtf(auVar162._0_4_);
          }
          else {
            auVar162 = vsqrtss_avx(auVar162,auVar162);
            fVar178 = auVar162._0_4_;
          }
          auVar249 = ZEXT464(uVar74);
          auVar8 = vminps_avx(_local_990,_local_9b0);
          auVar162 = vmaxps_avx(_local_990,_local_9b0);
          auVar9 = vminps_avx(_local_9a0,_local_9c0);
          auVar83 = vminps_avx(auVar8,auVar9);
          auVar8 = vmaxps_avx(_local_9a0,_local_9c0);
          auVar9 = vmaxps_avx(auVar162,auVar8);
          auVar165._8_4_ = 0x7fffffff;
          auVar165._0_8_ = 0x7fffffff7fffffff;
          auVar165._12_4_ = 0x7fffffff;
          auVar162 = vandps_avx(auVar83,auVar165);
          auVar8 = vandps_avx(auVar9,auVar165);
          auVar162 = vmaxps_avx(auVar162,auVar8);
          auVar8 = vmovshdup_avx(auVar162);
          auVar8 = vmaxss_avx(auVar8,auVar162);
          auVar162 = vshufpd_avx(auVar162,auVar162,1);
          auVar162 = vmaxss_avx(auVar162,auVar8);
          local_860 = auVar162._0_4_ * 1.9073486e-06;
          local_900._0_4_ = fVar178 * 1.9073486e-06;
          local_780._0_16_ = vshufps_avx(auVar9,auVar9,0xff);
          auVar162 = vinsertps_avx(ZEXT416(uVar74),ZEXT416((uint)fVar155),0x10);
          auVar318 = ZEXT1664(auVar162);
          lVar70 = 5;
          do {
            do {
              auVar162 = auVar318._0_16_;
              bVar77 = lVar70 == 0;
              lVar70 = lVar70 + -1;
              if (bVar77) goto LAB_007aa99c;
              auVar9 = vmovshdup_avx(auVar162);
              fVar155 = auVar9._0_4_;
              fVar177 = 1.0 - fVar155;
              fVar178 = fVar177 * fVar177;
              fVar175 = fVar177 * fVar178;
              fVar194 = fVar155 * fVar155;
              fVar176 = fVar155 * fVar194;
              fVar195 = fVar155 * fVar177;
              auVar8 = vshufps_avx(ZEXT416((uint)(fVar176 * 0.16666667)),
                                   ZEXT416((uint)(fVar176 * 0.16666667)),0);
              auVar83 = ZEXT416((uint)((fVar176 * 4.0 + fVar175 +
                                       fVar155 * fVar195 * 12.0 + fVar177 * fVar195 * 6.0) *
                                      0.16666667));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              auVar108 = ZEXT416((uint)((fVar175 * 4.0 + fVar176 +
                                        fVar177 * fVar195 * 12.0 + fVar155 * fVar195 * 6.0) *
                                       0.16666667));
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              auVar82 = vshufps_avx(auVar162,auVar162,0);
              auVar141._0_4_ = auVar82._0_4_ * local_840 + 0.0;
              auVar141._4_4_ = auVar82._4_4_ * fStack_83c + 0.0;
              auVar141._8_4_ = auVar82._8_4_ * fStack_838 + 0.0;
              auVar141._12_4_ = auVar82._12_4_ * aStack_834.w + 0.0;
              auVar82 = vshufps_avx(ZEXT416((uint)(fVar175 * 0.16666667)),
                                    ZEXT416((uint)(fVar175 * 0.16666667)),0);
              auVar86._0_4_ =
                   auVar82._0_4_ * (float)local_990._0_4_ +
                   auVar108._0_4_ * (float)local_9b0._0_4_ +
                   auVar8._0_4_ * (float)local_9c0._0_4_ + auVar83._0_4_ * (float)local_9a0._0_4_;
              auVar86._4_4_ =
                   auVar82._4_4_ * (float)local_990._4_4_ +
                   auVar108._4_4_ * (float)local_9b0._4_4_ +
                   auVar8._4_4_ * (float)local_9c0._4_4_ + auVar83._4_4_ * (float)local_9a0._4_4_;
              auVar86._8_4_ =
                   auVar82._8_4_ * fStack_988 +
                   auVar108._8_4_ * fStack_9a8 +
                   auVar8._8_4_ * fStack_9b8 + auVar83._8_4_ * fStack_998;
              auVar86._12_4_ =
                   auVar82._12_4_ * fStack_984 +
                   auVar108._12_4_ * fStack_9a4 +
                   auVar8._12_4_ * fStack_9b4 + auVar83._12_4_ * fStack_994;
              local_880._0_16_ = auVar86;
              auVar8 = vsubps_avx(auVar141,auVar86);
              _local_a40 = auVar8;
              auVar8 = vdpps_avx(auVar8,auVar8,0x7f);
              fVar175 = auVar8._0_4_;
              if (fVar175 < 0.0) {
                local_9e0._0_16_ = auVar9;
                local_980._0_4_ = fVar194;
                local_a00._0_4_ = fVar178;
                local_a20._0_4_ = fVar195;
                fVar176 = sqrtf(fVar175);
                fVar178 = (float)local_a00._0_4_;
                fVar194 = (float)local_980._0_4_;
                fVar195 = (float)local_a20._0_4_;
                fVar155 = (float)local_9e0._0_4_;
              }
              else {
                auVar9 = vsqrtss_avx(auVar8,auVar8);
                fVar176 = auVar9._0_4_;
              }
              auVar306 = ZEXT464((uint)fVar177);
              auVar9 = vshufps_avx(ZEXT416((uint)(fVar194 * 0.5)),ZEXT416((uint)(fVar194 * 0.5)),0);
              auVar83 = ZEXT416((uint)((fVar178 + fVar195 * 4.0) * 0.5));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              auVar108 = ZEXT416((uint)((fVar155 * -fVar155 - fVar195 * 4.0) * 0.5));
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              auVar82 = ZEXT416((uint)(fVar177 * -fVar177 * 0.5));
              auVar82 = vshufps_avx(auVar82,auVar82,0);
              auVar262._0_4_ =
                   (float)local_990._0_4_ * auVar82._0_4_ +
                   (float)local_9b0._0_4_ * auVar108._0_4_ +
                   (float)local_9c0._0_4_ * auVar9._0_4_ + (float)local_9a0._0_4_ * auVar83._0_4_;
              auVar262._4_4_ =
                   (float)local_990._4_4_ * auVar82._4_4_ +
                   (float)local_9b0._4_4_ * auVar108._4_4_ +
                   (float)local_9c0._4_4_ * auVar9._4_4_ + (float)local_9a0._4_4_ * auVar83._4_4_;
              auVar262._8_4_ =
                   fStack_988 * auVar82._8_4_ +
                   fStack_9a8 * auVar108._8_4_ +
                   fStack_9b8 * auVar9._8_4_ + fStack_998 * auVar83._8_4_;
              auVar262._12_4_ =
                   fStack_984 * auVar82._12_4_ +
                   fStack_9a4 * auVar108._12_4_ +
                   fStack_9b4 * auVar9._12_4_ + fStack_994 * auVar83._12_4_;
              auVar9 = vshufps_avx(auVar162,auVar162,0x55);
              auVar83 = ZEXT416((uint)(fVar177 - (fVar155 + fVar155)));
              auVar108 = vshufps_avx(auVar83,auVar83,0);
              auVar83 = ZEXT416((uint)(fVar155 - (fVar177 + fVar177)));
              auVar82 = vshufps_avx(auVar83,auVar83,0);
              auVar106 = ZEXT416((uint)fVar177);
              auVar78 = vshufps_avx(auVar106,auVar106,0);
              auVar83 = vdpps_avx(auVar262,auVar262,0x7f);
              auVar113._0_4_ =
                   (float)local_990._0_4_ * auVar78._0_4_ +
                   (float)local_9b0._0_4_ * auVar82._0_4_ +
                   (float)local_9c0._0_4_ * auVar9._0_4_ + (float)local_9a0._0_4_ * auVar108._0_4_;
              auVar113._4_4_ =
                   (float)local_990._4_4_ * auVar78._4_4_ +
                   (float)local_9b0._4_4_ * auVar82._4_4_ +
                   (float)local_9c0._4_4_ * auVar9._4_4_ + (float)local_9a0._4_4_ * auVar108._4_4_;
              auVar113._8_4_ =
                   fStack_988 * auVar78._8_4_ +
                   fStack_9a8 * auVar82._8_4_ +
                   fStack_9b8 * auVar9._8_4_ + fStack_998 * auVar108._8_4_;
              auVar113._12_4_ =
                   fStack_984 * auVar78._12_4_ +
                   fStack_9a4 * auVar82._12_4_ +
                   fStack_9b4 * auVar9._12_4_ + fStack_994 * auVar108._12_4_;
              auVar9 = vblendps_avx(auVar83,_DAT_01f45a50,0xe);
              auVar108 = vrsqrtss_avx(auVar9,auVar9);
              fVar178 = auVar108._0_4_;
              fVar155 = auVar83._0_4_;
              auVar108 = vdpps_avx(auVar262,auVar113,0x7f);
              auVar82 = vshufps_avx(auVar83,auVar83,0);
              auVar114._0_4_ = auVar113._0_4_ * auVar82._0_4_;
              auVar114._4_4_ = auVar113._4_4_ * auVar82._4_4_;
              auVar114._8_4_ = auVar113._8_4_ * auVar82._8_4_;
              auVar114._12_4_ = auVar113._12_4_ * auVar82._12_4_;
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              auVar184._0_4_ = auVar262._0_4_ * auVar108._0_4_;
              auVar184._4_4_ = auVar262._4_4_ * auVar108._4_4_;
              auVar184._8_4_ = auVar262._8_4_ * auVar108._8_4_;
              auVar184._12_4_ = auVar262._12_4_ * auVar108._12_4_;
              auVar78 = vsubps_avx(auVar114,auVar184);
              auVar108 = vrcpss_avx(auVar9,auVar9);
              auVar9 = vmaxss_avx(ZEXT416((uint)local_860),
                                  ZEXT416((uint)(auVar318._0_4_ * (float)local_900._0_4_)));
              auVar336 = ZEXT1664(auVar9);
              auVar108 = ZEXT416((uint)(auVar108._0_4_ * (2.0 - fVar155 * auVar108._0_4_)));
              auVar108 = vshufps_avx(auVar108,auVar108,0);
              uVar71 = CONCAT44(auVar262._4_4_,auVar262._0_4_);
              auVar201._0_8_ = uVar71 ^ 0x8000000080000000;
              auVar201._8_4_ = -auVar262._8_4_;
              auVar201._12_4_ = -auVar262._12_4_;
              auVar82 = ZEXT416((uint)(fVar178 * 1.5 + fVar155 * -0.5 * fVar178 * fVar178 * fVar178)
                               );
              auVar82 = vshufps_avx(auVar82,auVar82,0);
              auVar166._0_4_ = auVar82._0_4_ * auVar78._0_4_ * auVar108._0_4_;
              auVar166._4_4_ = auVar82._4_4_ * auVar78._4_4_ * auVar108._4_4_;
              auVar166._8_4_ = auVar82._8_4_ * auVar78._8_4_ * auVar108._8_4_;
              auVar166._12_4_ = auVar82._12_4_ * auVar78._12_4_ * auVar108._12_4_;
              auVar223._0_4_ = auVar262._0_4_ * auVar82._0_4_;
              auVar223._4_4_ = auVar262._4_4_ * auVar82._4_4_;
              auVar223._8_4_ = auVar262._8_4_ * auVar82._8_4_;
              auVar223._12_4_ = auVar262._12_4_ * auVar82._12_4_;
              local_9e0._0_4_ = auVar9._0_4_;
              if (fVar155 < 0.0) {
                local_980._0_4_ = fVar176;
                local_a00._0_16_ = auVar201;
                local_a20._0_16_ = auVar223;
                local_920._0_16_ = auVar166;
                auVar306 = ZEXT1664(auVar106);
                fVar155 = sqrtf(fVar155);
                auVar336 = ZEXT464((uint)local_9e0._0_4_);
                auVar166 = local_920._0_16_;
                auVar201 = local_a00._0_16_;
                auVar223 = local_a20._0_16_;
              }
              else {
                auVar9 = vsqrtss_avx(auVar83,auVar83);
                fVar155 = auVar9._0_4_;
                local_980._0_4_ = fVar176;
              }
              auVar9 = vdpps_avx(_local_a40,auVar223,0x7f);
              fVar155 = (local_860 / fVar155) * ((float)local_980._0_4_ + 1.0) +
                        auVar336._0_4_ + (float)local_980._0_4_ * local_860;
              auVar83 = vdpps_avx(auVar201,auVar223,0x7f);
              auVar108 = vdpps_avx(_local_a40,auVar166,0x7f);
              auVar62._4_4_ = fStack_83c;
              auVar62._0_4_ = local_840;
              auVar62._8_4_ = fStack_838;
              auVar62._12_4_ = aStack_834.a;
              auVar82 = vdpps_avx(auVar62,auVar223,0x7f);
              auVar78 = vdpps_avx(_local_a40,auVar201,0x7f);
              fVar178 = auVar83._0_4_ + auVar108._0_4_;
              fVar194 = auVar9._0_4_;
              auVar87._0_4_ = fVar194 * fVar194;
              auVar87._4_4_ = auVar9._4_4_ * auVar9._4_4_;
              auVar87._8_4_ = auVar9._8_4_ * auVar9._8_4_;
              auVar87._12_4_ = auVar9._12_4_ * auVar9._12_4_;
              auVar108 = vsubps_avx(auVar8,auVar87);
              local_980._0_16_ = ZEXT416((uint)fVar178);
              auVar83 = vdpps_avx(_local_a40,auVar62,0x7f);
              fVar176 = auVar78._0_4_ - fVar194 * fVar178;
              fVar194 = auVar83._0_4_ - fVar194 * auVar82._0_4_;
              auVar83 = vrsqrtss_avx(auVar108,auVar108);
              fVar195 = auVar108._0_4_;
              fVar178 = auVar83._0_4_;
              fVar178 = fVar178 * 1.5 + fVar195 * -0.5 * fVar178 * fVar178 * fVar178;
              if (fVar195 < 0.0) {
                local_a00._0_16_ = auVar9;
                local_a20._0_4_ = fVar155;
                local_920._0_16_ = auVar82;
                local_740._0_4_ = fVar176;
                local_8a0._0_4_ = fVar194;
                local_760._0_4_ = fVar178;
                auVar306 = ZEXT1664(auVar306._0_16_);
                fVar195 = sqrtf(fVar195);
                auVar336 = ZEXT464((uint)local_9e0._0_4_);
                fVar178 = (float)local_760._0_4_;
                fVar176 = (float)local_740._0_4_;
                fVar194 = (float)local_8a0._0_4_;
                auVar82 = local_920._0_16_;
                auVar9 = local_a00._0_16_;
                fVar155 = (float)local_a20._0_4_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar108,auVar108);
                fVar195 = auVar83._0_4_;
              }
              auVar249 = ZEXT1664(auVar8);
              auVar78 = vpermilps_avx(local_880._0_16_,0xff);
              auVar106 = vshufps_avx(auVar262,auVar262,0xff);
              fVar176 = fVar176 * fVar178 - auVar106._0_4_;
              auVar185._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
              auVar185._8_4_ = auVar82._8_4_ ^ 0x80000000;
              auVar185._12_4_ = auVar82._12_4_ ^ 0x80000000;
              auVar202._0_4_ = -fVar176;
              auVar202._4_4_ = 0x80000000;
              auVar202._8_4_ = 0x80000000;
              auVar202._12_4_ = 0x80000000;
              auVar298 = ZEXT1664(local_980._0_16_);
              auVar83 = vinsertps_avx(auVar202,ZEXT416((uint)(fVar194 * fVar178)),0x1c);
              auVar82 = vmovsldup_avx(ZEXT416((uint)(local_980._0_4_ * fVar194 * fVar178 -
                                                    auVar82._0_4_ * fVar176)));
              auVar83 = vdivps_avx(auVar83,auVar82);
              auVar108 = vinsertps_avx(local_980._0_16_,auVar185,0x10);
              auVar108 = vdivps_avx(auVar108,auVar82);
              auVar82 = vmovsldup_avx(auVar9);
              auVar85 = ZEXT416((uint)(fVar195 - auVar78._0_4_));
              auVar78 = vmovsldup_avx(auVar85);
              auVar142._0_4_ = auVar82._0_4_ * auVar83._0_4_ + auVar78._0_4_ * auVar108._0_4_;
              auVar142._4_4_ = auVar82._4_4_ * auVar83._4_4_ + auVar78._4_4_ * auVar108._4_4_;
              auVar142._8_4_ = auVar82._8_4_ * auVar83._8_4_ + auVar78._8_4_ * auVar108._8_4_;
              auVar142._12_4_ = auVar82._12_4_ * auVar83._12_4_ + auVar78._12_4_ * auVar108._12_4_;
              auVar83 = vsubps_avx(auVar162,auVar142);
              auVar318 = ZEXT1664(auVar83);
              auVar143._8_4_ = 0x7fffffff;
              auVar143._0_8_ = 0x7fffffff7fffffff;
              auVar143._12_4_ = 0x7fffffff;
              auVar162 = vandps_avx(auVar9,auVar143);
            } while (fVar155 <= auVar162._0_4_);
            auVar167._8_4_ = 0x7fffffff;
            auVar167._0_8_ = 0x7fffffff7fffffff;
            auVar167._12_4_ = 0x7fffffff;
            auVar162 = vandps_avx(auVar85,auVar167);
          } while ((float)local_780._0_4_ * 1.9073486e-06 + auVar336._0_4_ + fVar155 <=
                   auVar162._0_4_);
          fVar155 = auVar83._0_4_ + (float)local_820._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar155) &&
             (fVar178 = (ray->super_RayK<1>).tfar, fVar155 <= fVar178)) {
            auVar162 = vmovshdup_avx(auVar83);
            fVar194 = auVar162._0_4_;
            if ((0.0 <= fVar194) && (fVar194 <= 1.0)) {
              auVar162 = vrsqrtss_avx(auVar8,auVar8);
              fVar176 = auVar162._0_4_;
              pGVar5 = (context->scene->geometries).items[uVar67].ptr;
              if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar162 = ZEXT416((uint)(fVar176 * 1.5 +
                                         fVar175 * -0.5 * fVar176 * fVar176 * fVar176));
                auVar162 = vshufps_avx(auVar162,auVar162,0);
                auVar168._0_4_ = auVar162._0_4_ * (float)local_a40._0_4_;
                auVar168._4_4_ = auVar162._4_4_ * (float)local_a40._4_4_;
                auVar168._8_4_ = auVar162._8_4_ * fStack_a38;
                auVar168._12_4_ = auVar162._12_4_ * fStack_a34;
                auVar115._0_4_ = auVar262._0_4_ + auVar106._0_4_ * auVar168._0_4_;
                auVar115._4_4_ = auVar262._4_4_ + auVar106._4_4_ * auVar168._4_4_;
                auVar115._8_4_ = auVar262._8_4_ + auVar106._8_4_ * auVar168._8_4_;
                auVar115._12_4_ = auVar262._12_4_ + auVar106._12_4_ * auVar168._12_4_;
                auVar162 = vshufps_avx(auVar168,auVar168,0xc9);
                auVar9 = vshufps_avx(auVar262,auVar262,0xc9);
                auVar169._0_4_ = auVar9._0_4_ * auVar168._0_4_;
                auVar169._4_4_ = auVar9._4_4_ * auVar168._4_4_;
                auVar169._8_4_ = auVar9._8_4_ * auVar168._8_4_;
                auVar169._12_4_ = auVar9._12_4_ * auVar168._12_4_;
                auVar186._0_4_ = auVar262._0_4_ * auVar162._0_4_;
                auVar186._4_4_ = auVar262._4_4_ * auVar162._4_4_;
                auVar186._8_4_ = auVar262._8_4_ * auVar162._8_4_;
                auVar186._12_4_ = auVar262._12_4_ * auVar162._12_4_;
                auVar108 = vsubps_avx(auVar186,auVar169);
                auVar162 = vshufps_avx(auVar108,auVar108,0xc9);
                auVar9 = vshufps_avx(auVar115,auVar115,0xc9);
                auVar187._0_4_ = auVar9._0_4_ * auVar162._0_4_;
                auVar187._4_4_ = auVar9._4_4_ * auVar162._4_4_;
                auVar187._8_4_ = auVar9._8_4_ * auVar162._8_4_;
                auVar187._12_4_ = auVar9._12_4_ * auVar162._12_4_;
                auVar162 = vshufps_avx(auVar108,auVar108,0xd2);
                auVar116._0_4_ = auVar115._0_4_ * auVar162._0_4_;
                auVar116._4_4_ = auVar115._4_4_ * auVar162._4_4_;
                auVar116._8_4_ = auVar115._8_4_ * auVar162._8_4_;
                auVar116._12_4_ = auVar115._12_4_ * auVar162._12_4_;
                auVar9 = vsubps_avx(auVar187,auVar116);
                auVar162 = vshufps_avx(auVar9,auVar9,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar155;
                  uVar1 = vmovlps_avx(auVar162);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                  (ray->Ng).field_0.field_0.z = auVar9._0_4_;
                  ray->u = fVar194;
                  ray->v = 0.0;
                  ray->primID = local_8e0._0_4_;
                  ray->geomID = uVar67;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_950 = vmovlps_avx(auVar162);
                  local_948 = auVar9._0_4_;
                  local_944 = fVar194;
                  local_940 = 0;
                  local_93c = local_8e0._0_4_;
                  local_938 = uVar67;
                  local_934 = context->user->instID[0];
                  local_930 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar155;
                  local_a44 = -1;
                  local_a78.valid = &local_a44;
                  local_a78.geometryUserPtr = pGVar5->userPtr;
                  local_a78.context = context->user;
                  local_a78.hit = (RTCHitN *)&local_950;
                  local_a78.N = 1;
                  local_a78.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_007aaab7:
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      auVar298 = ZEXT1664(auVar298._0_16_);
                      auVar306 = ZEXT1664(auVar306._0_16_);
                      auVar318 = ZEXT1664(auVar318._0_16_);
                      auVar336 = ZEXT1664(auVar336._0_16_);
                      (*p_Var6)(&local_a78);
                      if (*local_a78.valid == 0) goto LAB_007aab57;
                    }
                    (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                         *(float *)local_a78.hit;
                    (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_a78.hit + 4);
                    (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_a78.hit + 8);
                    *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc);
                    *(float *)((long)local_a78.ray + 0x40) = *(float *)(local_a78.hit + 0x10);
                    *(float *)((long)local_a78.ray + 0x44) = *(float *)(local_a78.hit + 0x14);
                    *(float *)((long)local_a78.ray + 0x48) = *(float *)(local_a78.hit + 0x18);
                    *(float *)((long)local_a78.ray + 0x4c) = *(float *)(local_a78.hit + 0x1c);
                    *(float *)((long)local_a78.ray + 0x50) = *(float *)(local_a78.hit + 0x20);
                  }
                  else {
                    auVar249 = ZEXT1664(auVar8);
                    auVar298 = ZEXT1664(local_980._0_16_);
                    auVar306 = ZEXT1664(auVar306._0_16_);
                    auVar318 = ZEXT1664(auVar83);
                    auVar336 = ZEXT1664(auVar336._0_16_);
                    (*pGVar5->intersectionFilterN)(&local_a78);
                    if (*local_a78.valid != 0) goto LAB_007aaab7;
LAB_007aab57:
                    (ray->super_RayK<1>).tfar = fVar178;
                  }
                }
              }
            }
          }
LAB_007aa99c:
          fVar155 = (ray->super_RayK<1>).tfar;
          auVar127._4_4_ = fVar155;
          auVar127._0_4_ = fVar155;
          auVar127._8_4_ = fVar155;
          auVar127._12_4_ = fVar155;
          auVar127._16_4_ = fVar155;
          auVar127._20_4_ = fVar155;
          auVar127._24_4_ = fVar155;
          auVar127._28_4_ = fVar155;
          auVar89 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
          auVar90 = vcmpps_avx(_local_7a0,auVar127,2);
          auVar90 = vandps_avx(auVar90,local_720);
        }
        auVar90 = vandps_avx(local_6a0,local_680);
        auVar10 = vandps_avx(_local_7e0,_local_7c0);
        auVar191._0_4_ = local_800._0_4_ + local_5a0._0_4_;
        auVar191._4_4_ = local_800._4_4_ + local_5a0._4_4_;
        auVar191._8_4_ = local_800._8_4_ + local_5a0._8_4_;
        auVar191._12_4_ = local_800._12_4_ + local_5a0._12_4_;
        auVar191._16_4_ = local_800._16_4_ + local_5a0._16_4_;
        auVar191._20_4_ = local_800._20_4_ + local_5a0._20_4_;
        auVar191._24_4_ = local_800._24_4_ + local_5a0._24_4_;
        auVar191._28_4_ = local_800._28_4_ + local_5a0._28_4_;
        auVar162 = vshufps_avx(auVar89._0_16_,auVar89._0_16_,0);
        auVar211._16_16_ = auVar162;
        auVar211._0_16_ = auVar162;
        auVar89 = vcmpps_avx(auVar191,auVar211,2);
        auVar89 = vandps_avx(auVar89,auVar90);
        auVar192._0_4_ = local_800._0_4_ + local_5e0._0_4_;
        auVar192._4_4_ = local_800._4_4_ + local_5e0._4_4_;
        auVar192._8_4_ = local_800._8_4_ + local_5e0._8_4_;
        auVar192._12_4_ = local_800._12_4_ + local_5e0._12_4_;
        auVar192._16_4_ = local_800._16_4_ + local_5e0._16_4_;
        auVar192._20_4_ = local_800._20_4_ + local_5e0._20_4_;
        auVar192._24_4_ = local_800._24_4_ + local_5e0._24_4_;
        auVar192._28_4_ = local_800._28_4_ + local_5e0._28_4_;
        auVar90 = vcmpps_avx(auVar192,auVar211,2);
        auVar90 = vandps_avx(auVar90,auVar10);
        auVar90 = vorps_avx(auVar89,auVar90);
        if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar90 >> 0x7f,0) != '\0') ||
              (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar90 >> 0xbf,0) != '\0') ||
            (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar90[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar73 * 0x60) = auVar90;
          auVar89 = vblendvps_avx(_local_5e0,local_5a0,auVar89);
          *(undefined1 (*) [32])(auStack_160 + uVar73 * 0x60) = auVar89;
          uVar71 = vmovlps_avx(local_5f0);
          (&uStack_140)[uVar73 * 0xc] = uVar71;
          auStack_138[uVar73 * 0x18] = local_b0c + 1;
          uVar73 = (ulong)((int)uVar73 + 1);
        }
        uVar75 = local_8e0._0_4_;
      }
    }
    fVar155 = (ray->super_RayK<1>).tfar;
    auVar144._4_4_ = fVar155;
    auVar144._0_4_ = fVar155;
    auVar144._8_4_ = fVar155;
    auVar144._12_4_ = fVar155;
    auVar144._16_4_ = fVar155;
    auVar144._20_4_ = fVar155;
    auVar144._24_4_ = fVar155;
    auVar144._28_4_ = fVar155;
    while( true ) {
      uVar74 = (uint)uVar73;
      if (uVar74 == 0) {
        auVar88 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
        auVar88 = vshufps_avx(auVar88,auVar88,0);
        auVar88 = vcmpps_avx(local_600,auVar88,2);
        uVar67 = vmovmskps_avx(auVar88);
        uVar67 = (uint)uVar76 & uVar67;
        goto LAB_007a83fb;
      }
      uVar73 = (ulong)(uVar74 - 1);
      lVar70 = uVar73 * 0x60;
      auVar89 = *(undefined1 (*) [32])(auStack_160 + lVar70);
      auVar121._0_4_ = local_800._0_4_ + auVar89._0_4_;
      auVar121._4_4_ = local_800._4_4_ + auVar89._4_4_;
      auVar121._8_4_ = local_800._8_4_ + auVar89._8_4_;
      auVar121._12_4_ = local_800._12_4_ + auVar89._12_4_;
      auVar121._16_4_ = local_800._16_4_ + auVar89._16_4_;
      auVar121._20_4_ = local_800._20_4_ + auVar89._20_4_;
      auVar121._24_4_ = local_800._24_4_ + auVar89._24_4_;
      auVar121._28_4_ = local_800._28_4_ + auVar89._28_4_;
      auVar10 = vcmpps_avx(auVar121,auVar144,2);
      auVar213 = ZEXT3264(auVar10);
      auVar90 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar70));
      local_5a0 = auVar90;
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar70) & auVar10;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') break;
      uVar73 = (ulong)(uVar74 - 1);
    }
    auVar95._8_4_ = 0x7f800000;
    auVar95._0_8_ = 0x7f8000007f800000;
    auVar95._12_4_ = 0x7f800000;
    auVar95._16_4_ = 0x7f800000;
    auVar95._20_4_ = 0x7f800000;
    auVar95._24_4_ = 0x7f800000;
    auVar95._28_4_ = 0x7f800000;
    auVar89 = vblendvps_avx(auVar95,auVar89,auVar90);
    auVar10 = vshufps_avx(auVar89,auVar89,0xb1);
    auVar10 = vminps_avx(auVar89,auVar10);
    auVar12 = vshufpd_avx(auVar10,auVar10,5);
    auVar10 = vminps_avx(auVar10,auVar12);
    auVar12 = vperm2f128_avx(auVar10,auVar10,1);
    auVar10 = vminps_avx(auVar10,auVar12);
    auVar89 = vcmpps_avx(auVar89,auVar10,0);
    auVar10 = auVar90 & auVar89;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      auVar90 = vandps_avx(auVar89,auVar90);
    }
    auVar80._8_8_ = 0;
    auVar80._0_8_ = (&uStack_140)[uVar73 * 0xc];
    local_b0c = auStack_138[uVar73 * 0x18];
    uVar72 = vmovmskps_avx(auVar90);
    uVar68 = 0;
    if (uVar72 != 0) {
      for (; (uVar72 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
      }
    }
    *(undefined4 *)(local_5a0 + (ulong)uVar68 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar70) = local_5a0;
    uVar72 = uVar74 - 1;
    if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5a0 >> 0x7f,0) != '\0') ||
          (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5a0 >> 0xbf,0) != '\0') ||
        (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5a0[0x1f] < '\0') {
      uVar72 = uVar74;
    }
    auVar162 = vshufps_avx(auVar80,auVar80,0);
    auVar8 = vshufps_avx(auVar80,auVar80,0x55);
    auVar8 = vsubps_avx(auVar8,auVar162);
    local_5e0._4_4_ = auVar162._4_4_ + auVar8._4_4_ * 0.14285715;
    local_5e0._0_4_ = auVar162._0_4_ + auVar8._0_4_ * 0.0;
    fStack_5d8 = auVar162._8_4_ + auVar8._8_4_ * 0.2857143;
    fStack_5d4 = auVar162._12_4_ + auVar8._12_4_ * 0.42857146;
    fStack_5d0 = auVar162._0_4_ + auVar8._0_4_ * 0.5714286;
    fStack_5cc = auVar162._4_4_ + auVar8._4_4_ * 0.71428573;
    fStack_5c8 = auVar162._8_4_ + auVar8._8_4_ * 0.8571429;
    fStack_5c4 = auVar162._12_4_ + auVar8._12_4_;
    local_5f0._8_8_ = 0;
    local_5f0._0_8_ = *(ulong *)(local_5e0 + (ulong)uVar68 * 4);
    uVar73 = (ulong)uVar72;
    auVar89 = local_800;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }